

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_1,_true,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::QuadMvIntersectorKPluecker<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  BVH *bvh;
  ulong uVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  size_t k;
  RayK<16> *pRVar25;
  uint uVar26;
  uint uVar27;
  ushort uVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [64];
  undefined4 uVar32;
  long lVar33;
  ulong uVar34;
  NodeRef root;
  ulong uVar35;
  ulong *puVar36;
  bool bVar37;
  ulong uVar38;
  int iVar39;
  undefined1 auVar40 [32];
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  int iVar78;
  int iVar86;
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar87 [64];
  undefined1 in_ZMM2 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  TravRayK<16,_true> tray;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  uint local_a7b4;
  Precalculations local_a789;
  long local_a788;
  RayK<16> *local_a780;
  RayK<16> *local_a778;
  uint local_a76c;
  undefined1 (*local_a768) [32];
  ulong local_a760;
  RTCFilterFunctionNArguments local_a758;
  ulong local_a728;
  ulong local_a720;
  long local_a718;
  undefined8 local_a710;
  undefined8 uStack_a708;
  undefined1 local_a700 [64];
  undefined1 local_a6c0 [64];
  undefined1 local_a680 [64];
  undefined1 local_a640 [64];
  RTCHitN local_a600 [64];
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  undefined1 local_a500 [64];
  undefined1 local_a4c0 [64];
  undefined1 local_a480 [64];
  undefined1 local_a440 [64];
  undefined1 local_a400 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a3c0;
  undefined1 local_a300 [64];
  undefined1 local_a2c0 [64];
  undefined1 local_a280 [64];
  undefined1 local_a240 [64];
  undefined1 local_a200 [64];
  undefined1 local_a1c0 [64];
  undefined1 local_a180 [64];
  undefined1 local_a140 [64];
  undefined1 local_a100 [64];
  uint local_a0c0;
  uint uStack_a0bc;
  uint uStack_a0b8;
  uint uStack_a0b4;
  uint uStack_a0b0;
  uint uStack_a0ac;
  uint uStack_a0a8;
  uint uStack_a0a4;
  uint uStack_a0a0;
  uint uStack_a09c;
  uint uStack_a098;
  uint uStack_a094;
  uint uStack_a090;
  uint uStack_a08c;
  uint uStack_a088;
  uint uStack_a084;
  uint local_a080;
  uint uStack_a07c;
  uint uStack_a078;
  uint uStack_a074;
  uint uStack_a070;
  uint uStack_a06c;
  uint uStack_a068;
  uint uStack_a064;
  uint uStack_a060;
  uint uStack_a05c;
  uint uStack_a058;
  uint uStack_a054;
  uint uStack_a050;
  uint uStack_a04c;
  uint uStack_a048;
  uint uStack_a044;
  undefined1 local_a040 [64];
  undefined1 local_a000 [64];
  undefined1 local_9fc0 [64];
  undefined1 local_9f80 [64];
  undefined1 local_9f40 [64];
  undefined1 local_9f00 [64];
  undefined1 local_9ec0 [64];
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  ulong uVar28;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar41 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
      auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar38 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar87,5);
      uVar30 = vpcmpeqd_avx512f(auVar41,(undefined1  [64])valid_i->field_0);
      uVar38 = uVar38 & uVar30;
      if ((ushort)uVar38 != 0) {
        local_a3c0._0_8_ = *(undefined8 *)ray;
        local_a3c0._8_8_ = *(undefined8 *)(ray + 8);
        local_a3c0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_a3c0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_a3c0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_a3c0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_a3c0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_a3c0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_a3c0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_a3c0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_a3c0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_a3c0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_a3c0._96_8_ = *(undefined8 *)(ray + 0x60);
        local_a3c0._104_8_ = *(undefined8 *)(ray + 0x68);
        local_a3c0._112_8_ = *(undefined8 *)(ray + 0x70);
        local_a3c0._120_8_ = *(undefined8 *)(ray + 0x78);
        local_a3c0._128_8_ = *(undefined8 *)(ray + 0x80);
        local_a3c0._136_8_ = *(undefined8 *)(ray + 0x88);
        local_a3c0._144_8_ = *(undefined8 *)(ray + 0x90);
        local_a3c0._152_8_ = *(undefined8 *)(ray + 0x98);
        local_a3c0._160_8_ = *(undefined8 *)(ray + 0xa0);
        local_a3c0._168_8_ = *(undefined8 *)(ray + 0xa8);
        local_a3c0._176_8_ = *(undefined8 *)(ray + 0xb0);
        local_a3c0._184_8_ = *(undefined8 *)(ray + 0xb8);
        local_a300 = *(undefined1 (*) [64])(ray + 0x100);
        local_a2c0 = *(undefined1 (*) [64])(ray + 0x140);
        local_a280 = *(undefined1 (*) [64])(ray + 0x180);
        auVar42 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
        auVar41 = vandps_avx512dq(local_a300,auVar42);
        auVar43 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
        uVar30 = vcmpps_avx512f(auVar41,auVar43,1);
        auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar41 = vdivps_avx512f(auVar44,local_a300);
        auVar45 = vdivps_avx512f(auVar44,local_a2c0);
        auVar46 = vandps_avx512dq(local_a2c0,auVar42);
        uVar34 = vcmpps_avx512f(auVar46,auVar43,1);
        auVar46 = vandps_avx512dq(local_a280,auVar42);
        auVar47 = vdivps_avx512f(auVar44,local_a280);
        uVar28 = vcmpps_avx512f(auVar46,auVar43,1);
        auVar46 = vbroadcastss_avx512f(ZEXT416(0x5d5e0b6b));
        bVar37 = (bool)((byte)uVar30 & 1);
        iVar39 = auVar46._0_4_;
        local_a240._0_4_ = (uint)bVar37 * iVar39 | (uint)!bVar37 * auVar41._0_4_;
        bVar37 = (bool)((byte)(uVar30 >> 1) & 1);
        iVar72 = auVar46._4_4_;
        local_a240._4_4_ = (uint)bVar37 * iVar72 | (uint)!bVar37 * auVar41._4_4_;
        bVar37 = (bool)((byte)(uVar30 >> 2) & 1);
        iVar73 = auVar46._8_4_;
        local_a240._8_4_ = (uint)bVar37 * iVar73 | (uint)!bVar37 * auVar41._8_4_;
        bVar37 = (bool)((byte)(uVar30 >> 3) & 1);
        iVar74 = auVar46._12_4_;
        local_a240._12_4_ = (uint)bVar37 * iVar74 | (uint)!bVar37 * auVar41._12_4_;
        bVar37 = (bool)((byte)(uVar30 >> 4) & 1);
        iVar75 = auVar46._16_4_;
        local_a240._16_4_ = (uint)bVar37 * iVar75 | (uint)!bVar37 * auVar41._16_4_;
        bVar37 = (bool)((byte)(uVar30 >> 5) & 1);
        iVar76 = auVar46._20_4_;
        local_a240._20_4_ = (uint)bVar37 * iVar76 | (uint)!bVar37 * auVar41._20_4_;
        bVar37 = (bool)((byte)(uVar30 >> 6) & 1);
        iVar77 = auVar46._24_4_;
        local_a240._24_4_ = (uint)bVar37 * iVar77 | (uint)!bVar37 * auVar41._24_4_;
        bVar37 = (bool)((byte)(uVar30 >> 7) & 1);
        iVar78 = auVar46._28_4_;
        local_a240._28_4_ = (uint)bVar37 * iVar78 | (uint)!bVar37 * auVar41._28_4_;
        bVar37 = (bool)((byte)(uVar30 >> 8) & 1);
        iVar79 = auVar46._32_4_;
        local_a240._32_4_ = (uint)bVar37 * iVar79 | (uint)!bVar37 * auVar41._32_4_;
        bVar37 = (bool)((byte)(uVar30 >> 9) & 1);
        iVar80 = auVar46._36_4_;
        local_a240._36_4_ = (uint)bVar37 * iVar80 | (uint)!bVar37 * auVar41._36_4_;
        bVar37 = (bool)((byte)(uVar30 >> 10) & 1);
        iVar81 = auVar46._40_4_;
        local_a240._40_4_ = (uint)bVar37 * iVar81 | (uint)!bVar37 * auVar41._40_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xb) & 1);
        iVar82 = auVar46._44_4_;
        local_a240._44_4_ = (uint)bVar37 * iVar82 | (uint)!bVar37 * auVar41._44_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xc) & 1);
        iVar83 = auVar46._48_4_;
        local_a240._48_4_ = (uint)bVar37 * iVar83 | (uint)!bVar37 * auVar41._48_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xd) & 1);
        iVar84 = auVar46._52_4_;
        local_a240._52_4_ = (uint)bVar37 * iVar84 | (uint)!bVar37 * auVar41._52_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xe) & 1);
        iVar85 = auVar46._56_4_;
        iVar86 = auVar46._60_4_;
        local_a240._56_4_ = (uint)bVar37 * iVar85 | (uint)!bVar37 * auVar41._56_4_;
        bVar37 = SUB81(uVar30 >> 0xf,0);
        local_a240._60_4_ = (uint)bVar37 * iVar86 | (uint)!bVar37 * auVar41._60_4_;
        bVar37 = (bool)((byte)uVar34 & 1);
        local_a200._0_4_ = (uint)bVar37 * iVar39 | (uint)!bVar37 * auVar45._0_4_;
        bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
        local_a200._4_4_ = (uint)bVar37 * iVar72 | (uint)!bVar37 * auVar45._4_4_;
        bVar37 = (bool)((byte)(uVar34 >> 2) & 1);
        local_a200._8_4_ = (uint)bVar37 * iVar73 | (uint)!bVar37 * auVar45._8_4_;
        bVar37 = (bool)((byte)(uVar34 >> 3) & 1);
        local_a200._12_4_ = (uint)bVar37 * iVar74 | (uint)!bVar37 * auVar45._12_4_;
        bVar37 = (bool)((byte)(uVar34 >> 4) & 1);
        local_a200._16_4_ = (uint)bVar37 * iVar75 | (uint)!bVar37 * auVar45._16_4_;
        bVar37 = (bool)((byte)(uVar34 >> 5) & 1);
        local_a200._20_4_ = (uint)bVar37 * iVar76 | (uint)!bVar37 * auVar45._20_4_;
        bVar37 = (bool)((byte)(uVar34 >> 6) & 1);
        local_a200._24_4_ = (uint)bVar37 * iVar77 | (uint)!bVar37 * auVar45._24_4_;
        bVar37 = (bool)((byte)(uVar34 >> 7) & 1);
        local_a200._28_4_ = (uint)bVar37 * iVar78 | (uint)!bVar37 * auVar45._28_4_;
        bVar37 = (bool)((byte)(uVar34 >> 8) & 1);
        local_a200._32_4_ = (uint)bVar37 * iVar79 | (uint)!bVar37 * auVar45._32_4_;
        bVar37 = (bool)((byte)(uVar34 >> 9) & 1);
        local_a200._36_4_ = (uint)bVar37 * iVar80 | (uint)!bVar37 * auVar45._36_4_;
        bVar37 = (bool)((byte)(uVar34 >> 10) & 1);
        local_a200._40_4_ = (uint)bVar37 * iVar81 | (uint)!bVar37 * auVar45._40_4_;
        bVar37 = (bool)((byte)(uVar34 >> 0xb) & 1);
        local_a200._44_4_ = (uint)bVar37 * iVar82 | (uint)!bVar37 * auVar45._44_4_;
        bVar37 = (bool)((byte)(uVar34 >> 0xc) & 1);
        local_a200._48_4_ = (uint)bVar37 * iVar83 | (uint)!bVar37 * auVar45._48_4_;
        bVar37 = (bool)((byte)(uVar34 >> 0xd) & 1);
        local_a200._52_4_ = (uint)bVar37 * iVar84 | (uint)!bVar37 * auVar45._52_4_;
        bVar37 = (bool)((byte)(uVar34 >> 0xe) & 1);
        local_a200._56_4_ = (uint)bVar37 * iVar85 | (uint)!bVar37 * auVar45._56_4_;
        bVar37 = SUB81(uVar34 >> 0xf,0);
        local_a200._60_4_ = (uint)bVar37 * iVar86 | (uint)!bVar37 * auVar45._60_4_;
        bVar37 = (bool)((byte)uVar28 & 1);
        local_a1c0._0_4_ = (uint)bVar37 * iVar39 | (uint)!bVar37 * auVar47._0_4_;
        bVar37 = (bool)((byte)(uVar28 >> 1) & 1);
        local_a1c0._4_4_ = (uint)bVar37 * iVar72 | (uint)!bVar37 * auVar47._4_4_;
        bVar37 = (bool)((byte)(uVar28 >> 2) & 1);
        local_a1c0._8_4_ = (uint)bVar37 * iVar73 | (uint)!bVar37 * auVar47._8_4_;
        bVar37 = (bool)((byte)(uVar28 >> 3) & 1);
        local_a1c0._12_4_ = (uint)bVar37 * iVar74 | (uint)!bVar37 * auVar47._12_4_;
        bVar37 = (bool)((byte)(uVar28 >> 4) & 1);
        local_a1c0._16_4_ = (uint)bVar37 * iVar75 | (uint)!bVar37 * auVar47._16_4_;
        bVar37 = (bool)((byte)(uVar28 >> 5) & 1);
        local_a1c0._20_4_ = (uint)bVar37 * iVar76 | (uint)!bVar37 * auVar47._20_4_;
        bVar37 = (bool)((byte)(uVar28 >> 6) & 1);
        local_a1c0._24_4_ = (uint)bVar37 * iVar77 | (uint)!bVar37 * auVar47._24_4_;
        bVar37 = (bool)((byte)(uVar28 >> 7) & 1);
        local_a1c0._28_4_ = (uint)bVar37 * iVar78 | (uint)!bVar37 * auVar47._28_4_;
        bVar37 = (bool)((byte)(uVar28 >> 8) & 1);
        local_a1c0._32_4_ = (uint)bVar37 * iVar79 | (uint)!bVar37 * auVar47._32_4_;
        bVar37 = (bool)((byte)(uVar28 >> 9) & 1);
        local_a1c0._36_4_ = (uint)bVar37 * iVar80 | (uint)!bVar37 * auVar47._36_4_;
        bVar37 = (bool)((byte)(uVar28 >> 10) & 1);
        local_a1c0._40_4_ = (uint)bVar37 * iVar81 | (uint)!bVar37 * auVar47._40_4_;
        bVar37 = (bool)((byte)(uVar28 >> 0xb) & 1);
        local_a1c0._44_4_ = (uint)bVar37 * iVar82 | (uint)!bVar37 * auVar47._44_4_;
        bVar37 = (bool)((byte)(uVar28 >> 0xc) & 1);
        local_a1c0._48_4_ = (uint)bVar37 * iVar83 | (uint)!bVar37 * auVar47._48_4_;
        bVar37 = (bool)((byte)(uVar28 >> 0xd) & 1);
        local_a1c0._52_4_ = (uint)bVar37 * iVar84 | (uint)!bVar37 * auVar47._52_4_;
        bVar37 = (bool)((byte)(uVar28 >> 0xe) & 1);
        local_a1c0._56_4_ = (uint)bVar37 * iVar85 | (uint)!bVar37 * auVar47._56_4_;
        bVar37 = SUB81(uVar28 >> 0xf,0);
        local_a1c0._60_4_ = (uint)bVar37 * iVar86 | (uint)!bVar37 * auVar47._60_4_;
        uVar30 = vcmpps_avx512f(local_a240,auVar87,1);
        auVar41 = vpbroadcastd_avx512f(ZEXT416(0x20));
        auVar45._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar41._4_4_;
        auVar45._0_4_ = (uint)((byte)uVar30 & 1) * auVar41._0_4_;
        auVar45._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar41._8_4_;
        auVar45._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar41._12_4_;
        auVar45._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar41._16_4_;
        auVar45._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar41._20_4_;
        auVar45._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar41._24_4_;
        auVar45._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar41._28_4_;
        auVar45._32_4_ = (uint)((byte)(uVar30 >> 8) & 1) * auVar41._32_4_;
        auVar45._36_4_ = (uint)((byte)(uVar30 >> 9) & 1) * auVar41._36_4_;
        auVar45._40_4_ = (uint)((byte)(uVar30 >> 10) & 1) * auVar41._40_4_;
        auVar45._44_4_ = (uint)((byte)(uVar30 >> 0xb) & 1) * auVar41._44_4_;
        auVar45._48_4_ = (uint)((byte)(uVar30 >> 0xc) & 1) * auVar41._48_4_;
        auVar45._52_4_ = (uint)((byte)(uVar30 >> 0xd) & 1) * auVar41._52_4_;
        auVar45._56_4_ = (uint)((byte)(uVar30 >> 0xe) & 1) * auVar41._56_4_;
        auVar45._60_4_ = (uint)(byte)(uVar30 >> 0xf) * auVar41._60_4_;
        local_a180 = vmovdqa64_avx512f(auVar45);
        uVar30 = vcmpps_avx512f(local_a200,auVar87,5);
        auVar41 = vpbroadcastd_avx512f(ZEXT416(0x60));
        auVar45 = vpbroadcastd_avx512f(ZEXT416(0x40));
        bVar37 = (bool)((byte)uVar30 & 1);
        auVar46._0_4_ = (uint)bVar37 * auVar45._0_4_ | (uint)!bVar37 * auVar41._0_4_;
        bVar37 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar37 * auVar45._4_4_ | (uint)!bVar37 * auVar41._4_4_;
        bVar37 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar37 * auVar45._8_4_ | (uint)!bVar37 * auVar41._8_4_;
        bVar37 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar37 * auVar45._12_4_ | (uint)!bVar37 * auVar41._12_4_;
        bVar37 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar46._16_4_ = (uint)bVar37 * auVar45._16_4_ | (uint)!bVar37 * auVar41._16_4_;
        bVar37 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar46._20_4_ = (uint)bVar37 * auVar45._20_4_ | (uint)!bVar37 * auVar41._20_4_;
        bVar37 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar46._24_4_ = (uint)bVar37 * auVar45._24_4_ | (uint)!bVar37 * auVar41._24_4_;
        bVar37 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar46._28_4_ = (uint)bVar37 * auVar45._28_4_ | (uint)!bVar37 * auVar41._28_4_;
        bVar37 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar46._32_4_ = (uint)bVar37 * auVar45._32_4_ | (uint)!bVar37 * auVar41._32_4_;
        bVar37 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar46._36_4_ = (uint)bVar37 * auVar45._36_4_ | (uint)!bVar37 * auVar41._36_4_;
        bVar37 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar46._40_4_ = (uint)bVar37 * auVar45._40_4_ | (uint)!bVar37 * auVar41._40_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar46._44_4_ = (uint)bVar37 * auVar45._44_4_ | (uint)!bVar37 * auVar41._44_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar46._48_4_ = (uint)bVar37 * auVar45._48_4_ | (uint)!bVar37 * auVar41._48_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar46._52_4_ = (uint)bVar37 * auVar45._52_4_ | (uint)!bVar37 * auVar41._52_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar46._56_4_ = (uint)bVar37 * auVar45._56_4_ | (uint)!bVar37 * auVar41._56_4_;
        bVar37 = SUB81(uVar30 >> 0xf,0);
        auVar46._60_4_ = (uint)bVar37 * auVar45._60_4_ | (uint)!bVar37 * auVar41._60_4_;
        local_a140 = vmovdqa64_avx512f(auVar46);
        uVar30 = vcmpps_avx512f(local_a1c0,auVar87,5);
        auVar41 = vpbroadcastd_avx512f(ZEXT416(0xa0));
        auVar45 = vpbroadcastd_avx512f(ZEXT416(0x80));
        bVar37 = (bool)((byte)uVar30 & 1);
        auVar47._0_4_ = (uint)bVar37 * auVar45._0_4_ | (uint)!bVar37 * auVar41._0_4_;
        bVar37 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar37 * auVar45._4_4_ | (uint)!bVar37 * auVar41._4_4_;
        bVar37 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar37 * auVar45._8_4_ | (uint)!bVar37 * auVar41._8_4_;
        bVar37 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar37 * auVar45._12_4_ | (uint)!bVar37 * auVar41._12_4_;
        bVar37 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar47._16_4_ = (uint)bVar37 * auVar45._16_4_ | (uint)!bVar37 * auVar41._16_4_;
        bVar37 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar47._20_4_ = (uint)bVar37 * auVar45._20_4_ | (uint)!bVar37 * auVar41._20_4_;
        bVar37 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar47._24_4_ = (uint)bVar37 * auVar45._24_4_ | (uint)!bVar37 * auVar41._24_4_;
        bVar37 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar47._28_4_ = (uint)bVar37 * auVar45._28_4_ | (uint)!bVar37 * auVar41._28_4_;
        bVar37 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar47._32_4_ = (uint)bVar37 * auVar45._32_4_ | (uint)!bVar37 * auVar41._32_4_;
        bVar37 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar47._36_4_ = (uint)bVar37 * auVar45._36_4_ | (uint)!bVar37 * auVar41._36_4_;
        bVar37 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar47._40_4_ = (uint)bVar37 * auVar45._40_4_ | (uint)!bVar37 * auVar41._40_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar47._44_4_ = (uint)bVar37 * auVar45._44_4_ | (uint)!bVar37 * auVar41._44_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar47._48_4_ = (uint)bVar37 * auVar45._48_4_ | (uint)!bVar37 * auVar41._48_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar47._52_4_ = (uint)bVar37 * auVar45._52_4_ | (uint)!bVar37 * auVar41._52_4_;
        bVar37 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar47._56_4_ = (uint)bVar37 * auVar45._56_4_ | (uint)!bVar37 * auVar41._56_4_;
        bVar37 = SUB81(uVar30 >> 0xf,0);
        auVar47._60_4_ = (uint)bVar37 * auVar45._60_4_ | (uint)!bVar37 * auVar41._60_4_;
        local_a100 = vmovdqa64_avx512f(auVar47);
        auVar45 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
        auVar41 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar87);
        bVar37 = (bool)((byte)uVar38 & 1);
        local_a0c0 = (uint)bVar37 * auVar41._0_4_ | (uint)!bVar37 * auVar45._0_4_;
        bVar37 = (bool)((byte)(uVar38 >> 1) & 1);
        uStack_a0bc = (uint)bVar37 * auVar41._4_4_ | (uint)!bVar37 * auVar45._4_4_;
        bVar37 = (bool)((byte)(uVar38 >> 2) & 1);
        uStack_a0b8 = (uint)bVar37 * auVar41._8_4_ | (uint)!bVar37 * auVar45._8_4_;
        bVar37 = (bool)((byte)(uVar38 >> 3) & 1);
        uStack_a0b4 = (uint)bVar37 * auVar41._12_4_ | (uint)!bVar37 * auVar45._12_4_;
        bVar37 = (bool)((byte)(uVar38 >> 4) & 1);
        uStack_a0b0 = (uint)bVar37 * auVar41._16_4_ | (uint)!bVar37 * auVar45._16_4_;
        bVar37 = (bool)((byte)(uVar38 >> 5) & 1);
        uStack_a0ac = (uint)bVar37 * auVar41._20_4_ | (uint)!bVar37 * auVar45._20_4_;
        bVar37 = (bool)((byte)(uVar38 >> 6) & 1);
        uStack_a0a8 = (uint)bVar37 * auVar41._24_4_ | (uint)!bVar37 * auVar45._24_4_;
        bVar37 = (bool)((byte)(uVar38 >> 7) & 1);
        uStack_a0a4 = (uint)bVar37 * auVar41._28_4_ | (uint)!bVar37 * auVar45._28_4_;
        bVar12 = (byte)(uVar38 >> 8);
        bVar37 = (bool)(bVar12 & 1);
        uStack_a0a0 = (uint)bVar37 * auVar41._32_4_ | (uint)!bVar37 * auVar45._32_4_;
        bVar37 = (bool)((byte)(uVar38 >> 9) & 1);
        uStack_a09c = (uint)bVar37 * auVar41._36_4_ | (uint)!bVar37 * auVar45._36_4_;
        bVar37 = (bool)((byte)(uVar38 >> 10) & 1);
        uStack_a098 = (uint)bVar37 * auVar41._40_4_ | (uint)!bVar37 * auVar45._40_4_;
        bVar37 = (bool)((byte)(uVar38 >> 0xb) & 1);
        uStack_a094 = (uint)bVar37 * auVar41._44_4_ | (uint)!bVar37 * auVar45._44_4_;
        bVar37 = (bool)((byte)(uVar38 >> 0xc) & 1);
        uStack_a090 = (uint)bVar37 * auVar41._48_4_ | (uint)!bVar37 * auVar45._48_4_;
        bVar37 = (bool)((byte)(uVar38 >> 0xd) & 1);
        uStack_a08c = (uint)bVar37 * auVar41._52_4_ | (uint)!bVar37 * auVar45._52_4_;
        bVar37 = (bool)((byte)(uVar38 >> 0xe) & 1);
        uStack_a088 = (uint)bVar37 * auVar41._56_4_ | (uint)!bVar37 * auVar45._56_4_;
        bVar37 = SUB81(uVar38 >> 0xf,0);
        uStack_a084 = (uint)bVar37 * auVar41._60_4_ | (uint)!bVar37 * auVar45._60_4_;
        auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
        auVar41 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar87);
        bVar37 = (bool)((byte)uVar38 & 1);
        bVar5 = (bool)((byte)(uVar38 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar38 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar38 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar38 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar38 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar38 >> 6) & 1);
        bVar11 = (bool)((byte)(uVar38 >> 7) & 1);
        bVar13 = (bool)(bVar12 & 1);
        bVar14 = (bool)((byte)(uVar38 >> 9) & 1);
        bVar15 = (bool)((byte)(uVar38 >> 10) & 1);
        bVar16 = (bool)((byte)(uVar38 >> 0xb) & 1);
        bVar17 = (bool)((byte)(uVar38 >> 0xc) & 1);
        bVar18 = (bool)((byte)(uVar38 >> 0xd) & 1);
        bVar19 = (bool)((byte)(uVar38 >> 0xe) & 1);
        bVar20 = SUB81(uVar38 >> 0xf,0);
        local_a080 = (uint)bVar37 * auVar41._0_4_ | (uint)!bVar37 * auVar46._0_4_;
        uStack_a07c = (uint)bVar5 * auVar41._4_4_ | (uint)!bVar5 * auVar46._4_4_;
        uStack_a078 = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * auVar46._8_4_;
        uStack_a074 = (uint)bVar7 * auVar41._12_4_ | (uint)!bVar7 * auVar46._12_4_;
        uStack_a070 = (uint)bVar8 * auVar41._16_4_ | (uint)!bVar8 * auVar46._16_4_;
        uStack_a06c = (uint)bVar9 * auVar41._20_4_ | (uint)!bVar9 * auVar46._20_4_;
        uStack_a068 = (uint)bVar10 * auVar41._24_4_ | (uint)!bVar10 * auVar46._24_4_;
        uStack_a064 = (uint)bVar11 * auVar41._28_4_ | (uint)!bVar11 * auVar46._28_4_;
        uStack_a060 = (uint)bVar13 * auVar41._32_4_ | (uint)!bVar13 * auVar46._32_4_;
        uStack_a05c = (uint)bVar14 * auVar41._36_4_ | (uint)!bVar14 * auVar46._36_4_;
        uStack_a058 = (uint)bVar15 * auVar41._40_4_ | (uint)!bVar15 * auVar46._40_4_;
        uStack_a054 = (uint)bVar16 * auVar41._44_4_ | (uint)!bVar16 * auVar46._44_4_;
        uStack_a050 = (uint)bVar17 * auVar41._48_4_ | (uint)!bVar17 * auVar46._48_4_;
        uStack_a04c = (uint)bVar18 * auVar41._52_4_ | (uint)!bVar18 * auVar46._52_4_;
        uStack_a048 = (uint)bVar19 * auVar41._56_4_ | (uint)!bVar19 * auVar46._56_4_;
        uStack_a044 = (uint)bVar20 * auVar41._60_4_ | (uint)!bVar20 * auVar46._60_4_;
        local_a7b4 = (uint)(ushort)~(ushort)uVar38;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar30 = 0xe;
        }
        else {
          uVar30 = 2;
          if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)
          {
            uVar30 = 0xe;
          }
        }
        local_a778 = ray + 0x200;
        puVar36 = local_9e40;
        local_9e50 = 0xfffffffffffffff8;
        pauVar31 = (undefined1 (*) [64])local_8c40;
        local_8c80 = local_a0c0;
        uStack_8c7c = uStack_a0bc;
        uStack_8c78 = uStack_a0b8;
        uStack_8c74 = uStack_a0b4;
        uStack_8c70 = uStack_a0b0;
        uStack_8c6c = uStack_a0ac;
        uStack_8c68 = uStack_a0a8;
        uStack_8c64 = uStack_a0a4;
        uStack_8c60 = uStack_a0a0;
        uStack_8c5c = uStack_a09c;
        uStack_8c58 = uStack_a098;
        uStack_8c54 = uStack_a094;
        uStack_8c50 = uStack_a090;
        uStack_8c4c = uStack_a08c;
        uStack_8c48 = uStack_a088;
        uStack_8c44 = uStack_a084;
        local_9e48 = (bvh->root).ptr;
        local_a768 = (undefined1 (*) [32])local_a440;
        auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
        auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
        local_a760 = uVar30;
        local_8cc0 = auVar45;
LAB_008e0f5c:
        pauVar31 = pauVar31 + -1;
        root.ptr = puVar36[-1];
        puVar36 = puVar36 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_008e1fbf;
        local_a700 = *pauVar31;
        auVar48._4_4_ = uStack_a07c;
        auVar48._0_4_ = local_a080;
        auVar48._8_4_ = uStack_a078;
        auVar48._12_4_ = uStack_a074;
        auVar48._16_4_ = uStack_a070;
        auVar48._20_4_ = uStack_a06c;
        auVar48._24_4_ = uStack_a068;
        auVar48._28_4_ = uStack_a064;
        auVar48._32_4_ = uStack_a060;
        auVar48._36_4_ = uStack_a05c;
        auVar48._40_4_ = uStack_a058;
        auVar48._44_4_ = uStack_a054;
        auVar48._48_4_ = uStack_a050;
        auVar48._52_4_ = uStack_a04c;
        auVar48._56_4_ = uStack_a048;
        auVar48._60_4_ = uStack_a044;
        uVar34 = vcmpps_avx512f(local_a700,auVar48,1);
        if ((short)uVar34 == 0) {
LAB_008e1fd0:
          iVar39 = 2;
        }
        else {
          uVar32 = (undefined4)uVar34;
          iVar39 = 0;
          pRVar25 = ray;
          if ((uint)POPCOUNT(uVar32) <= uVar30) {
            do {
              local_a780 = pRVar25;
              k = 0;
              for (uVar30 = uVar34; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              bVar37 = occluded1(This,bvh,root,k,&local_a789,local_a780,
                                 (TravRayK<16,_true> *)&local_a3c0.field_0,context);
              uVar26 = 1 << ((uint)k & 0x1f);
              if (!bVar37) {
                uVar26 = 0;
              }
              local_a7b4 = local_a7b4 | uVar26;
              uVar34 = uVar34 - 1 & uVar34;
              pRVar25 = local_a780;
            } while (uVar34 != 0);
            if ((short)local_a7b4 == -1) {
              iVar39 = 3;
            }
            else {
              auVar41 = vbroadcastss_avx512f(ZEXT416(0xff800000));
              bVar37 = (bool)((byte)local_a7b4 & 1);
              bVar5 = (bool)((byte)(local_a7b4 >> 1) & 1);
              bVar6 = (bool)((byte)(local_a7b4 >> 2) & 1);
              bVar7 = (bool)((byte)(local_a7b4 >> 3) & 1);
              bVar8 = (bool)((byte)(local_a7b4 >> 4) & 1);
              bVar9 = (bool)((byte)(local_a7b4 >> 5) & 1);
              bVar10 = (bool)((byte)(local_a7b4 >> 6) & 1);
              bVar11 = (bool)((byte)(local_a7b4 >> 7) & 1);
              bVar13 = (bool)((byte)(local_a7b4 >> 8) & 1);
              bVar14 = (bool)((byte)(local_a7b4 >> 9) & 1);
              bVar15 = (bool)((byte)(local_a7b4 >> 10) & 1);
              bVar16 = (bool)((byte)(local_a7b4 >> 0xb) & 1);
              bVar17 = (bool)((byte)(local_a7b4 >> 0xc) & 1);
              bVar18 = (bool)((byte)(local_a7b4 >> 0xd) & 1);
              bVar19 = (bool)((byte)(local_a7b4 >> 0xe) & 1);
              bVar20 = (bool)((byte)(local_a7b4 >> 0xf) & 1);
              local_a080 = (uint)bVar37 * auVar41._0_4_ | !bVar37 * local_a080;
              uStack_a07c = (uint)bVar5 * auVar41._4_4_ | !bVar5 * uStack_a07c;
              uStack_a078 = (uint)bVar6 * auVar41._8_4_ | !bVar6 * uStack_a078;
              uStack_a074 = (uint)bVar7 * auVar41._12_4_ | !bVar7 * uStack_a074;
              uStack_a070 = (uint)bVar8 * auVar41._16_4_ | !bVar8 * uStack_a070;
              uStack_a06c = (uint)bVar9 * auVar41._20_4_ | !bVar9 * uStack_a06c;
              uStack_a068 = (uint)bVar10 * auVar41._24_4_ | !bVar10 * uStack_a068;
              uStack_a064 = (uint)bVar11 * auVar41._28_4_ | !bVar11 * uStack_a064;
              uStack_a060 = (uint)bVar13 * auVar41._32_4_ | !bVar13 * uStack_a060;
              uStack_a05c = (uint)bVar14 * auVar41._36_4_ | !bVar14 * uStack_a05c;
              uStack_a058 = (uint)bVar15 * auVar41._40_4_ | !bVar15 * uStack_a058;
              uStack_a054 = (uint)bVar16 * auVar41._44_4_ | !bVar16 * uStack_a054;
              uStack_a050 = (uint)bVar17 * auVar41._48_4_ | !bVar17 * uStack_a050;
              uStack_a04c = (uint)bVar18 * auVar41._52_4_ | !bVar18 * uStack_a04c;
              uStack_a048 = (uint)bVar19 * auVar41._56_4_ | !bVar19 * uStack_a048;
              uStack_a044 = (uint)bVar20 * auVar41._60_4_ | !bVar20 * uStack_a044;
              iVar39 = 2;
            }
            auVar42 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
            auVar43 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
            auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
            auVar45 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
            uVar38 = uVar38 & 0xffffffff;
            auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
            auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
            ray = local_a780;
          }
          uVar30 = local_a760;
          if ((uint)local_a760 < (uint)POPCOUNT(uVar32)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_008e1fbf;
                auVar49._4_4_ = uStack_a07c;
                auVar49._0_4_ = local_a080;
                auVar49._8_4_ = uStack_a078;
                auVar49._12_4_ = uStack_a074;
                auVar49._16_4_ = uStack_a070;
                auVar49._20_4_ = uStack_a06c;
                auVar49._24_4_ = uStack_a068;
                auVar49._28_4_ = uStack_a064;
                auVar49._32_4_ = uStack_a060;
                auVar49._36_4_ = uStack_a05c;
                auVar49._40_4_ = uStack_a058;
                auVar49._44_4_ = uStack_a054;
                auVar49._48_4_ = uStack_a050;
                auVar49._52_4_ = uStack_a04c;
                auVar49._56_4_ = uStack_a048;
                auVar49._60_4_ = uStack_a044;
                uVar22 = vcmpps_avx512f(local_a700,auVar49,9);
                if ((short)uVar22 == 0) goto LAB_008e1fd0;
                local_a728 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar26 = local_a7b4;
                if (local_a728 == 0) goto LAB_008e1f91;
                uVar26 = ~local_a7b4;
                lVar33 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar30 = 0;
                goto LAB_008e11c1;
              }
              uVar34 = 0;
              uVar28 = 8;
              auVar47 = auVar45;
              do {
                uVar1 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar34 * 8);
                uVar35 = uVar28;
                local_a700 = auVar47;
                if (uVar1 != 8) {
                  auVar48 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x40 + uVar34 * 4)));
                  auVar55._8_8_ = local_a3c0._8_8_;
                  auVar55._0_8_ = local_a3c0._0_8_;
                  auVar55._16_8_ = local_a3c0._16_8_;
                  auVar55._24_8_ = local_a3c0._24_8_;
                  auVar55._32_8_ = local_a3c0._32_8_;
                  auVar55._40_8_ = local_a3c0._40_8_;
                  auVar55._48_8_ = local_a3c0._48_8_;
                  auVar55._56_8_ = local_a3c0._56_8_;
                  auVar56._8_8_ = local_a3c0._72_8_;
                  auVar56._0_8_ = local_a3c0._64_8_;
                  auVar56._16_8_ = local_a3c0._80_8_;
                  auVar56._24_8_ = local_a3c0._88_8_;
                  auVar56._32_8_ = local_a3c0._96_8_;
                  auVar56._40_8_ = local_a3c0._104_8_;
                  auVar56._48_8_ = local_a3c0._112_8_;
                  auVar56._56_8_ = local_a3c0._120_8_;
                  auVar63._8_8_ = local_a3c0._136_8_;
                  auVar63._0_8_ = local_a3c0._128_8_;
                  auVar63._16_8_ = local_a3c0._144_8_;
                  auVar63._24_8_ = local_a3c0._152_8_;
                  auVar63._32_8_ = local_a3c0._160_8_;
                  auVar63._40_8_ = local_a3c0._168_8_;
                  auVar63._48_8_ = local_a3c0._176_8_;
                  auVar63._56_8_ = local_a3c0._184_8_;
                  auVar48 = vsubps_avx512f(auVar48,auVar55);
                  auVar48 = vmulps_avx512f(local_a240,auVar48);
                  auVar49 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x80 + uVar34 * 4)));
                  auVar49 = vsubps_avx512f(auVar49,auVar56);
                  auVar49 = vmulps_avx512f(local_a200,auVar49);
                  auVar50 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xc0 + uVar34 * 4)));
                  auVar50 = vsubps_avx512f(auVar50,auVar63);
                  auVar50 = vmulps_avx512f(local_a1c0,auVar50);
                  auVar51 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x60 + uVar34 * 4)));
                  auVar51 = vsubps_avx512f(auVar51,auVar55);
                  auVar51 = vmulps_avx512f(local_a240,auVar51);
                  auVar52 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xa0 + uVar34 * 4)));
                  auVar52 = vsubps_avx512f(auVar52,auVar56);
                  auVar52 = vmulps_avx512f(local_a200,auVar52);
                  auVar53 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xe0 + uVar34 * 4)));
                  auVar53 = vsubps_avx512f(auVar53,auVar63);
                  auVar53 = vmulps_avx512f(local_a1c0,auVar53);
                  auVar54 = vminps_avx512f(auVar48,auVar51);
                  auVar55 = vminps_avx512f(auVar49,auVar52);
                  auVar54 = vmaxps_avx512f(auVar54,auVar55);
                  auVar55 = vminps_avx512f(auVar50,auVar53);
                  auVar54 = vmaxps_avx512f(auVar54,auVar55);
                  auVar54 = vmulps_avx512f(auVar54,auVar87);
                  auVar48 = vmaxps_avx512f(auVar48,auVar51);
                  auVar49 = vmaxps_avx512f(auVar49,auVar52);
                  auVar48 = vminps_avx512f(auVar48,auVar49);
                  auVar49 = vmaxps_avx512f(auVar50,auVar53);
                  auVar48 = vminps_avx512f(auVar48,auVar49);
                  auVar48 = vmulps_avx512f(auVar48,auVar41);
                  auVar64._4_4_ = uStack_a0bc;
                  auVar64._0_4_ = local_a0c0;
                  auVar64._8_4_ = uStack_a0b8;
                  auVar64._12_4_ = uStack_a0b4;
                  auVar64._16_4_ = uStack_a0b0;
                  auVar64._20_4_ = uStack_a0ac;
                  auVar64._24_4_ = uStack_a0a8;
                  auVar64._28_4_ = uStack_a0a4;
                  auVar64._32_4_ = uStack_a0a0;
                  auVar64._36_4_ = uStack_a09c;
                  auVar64._40_4_ = uStack_a098;
                  auVar64._44_4_ = uStack_a094;
                  auVar64._48_4_ = uStack_a090;
                  auVar64._52_4_ = uStack_a08c;
                  auVar64._56_4_ = uStack_a088;
                  auVar64._60_4_ = uStack_a084;
                  auVar49 = vmaxps_avx512f(auVar54,auVar64);
                  auVar65._4_4_ = uStack_a07c;
                  auVar65._0_4_ = local_a080;
                  auVar65._8_4_ = uStack_a078;
                  auVar65._12_4_ = uStack_a074;
                  auVar65._16_4_ = uStack_a070;
                  auVar65._20_4_ = uStack_a06c;
                  auVar65._24_4_ = uStack_a068;
                  auVar65._28_4_ = uStack_a064;
                  auVar65._32_4_ = uStack_a060;
                  auVar65._36_4_ = uStack_a05c;
                  auVar65._40_4_ = uStack_a058;
                  auVar65._44_4_ = uStack_a054;
                  auVar65._48_4_ = uStack_a050;
                  auVar65._52_4_ = uStack_a04c;
                  auVar65._56_4_ = uStack_a048;
                  auVar65._60_4_ = uStack_a044;
                  auVar48 = vminps_avx512f(auVar48,auVar65);
                  uVar21 = vcmpps_avx512f(auVar49,auVar48,2);
                  if ((short)uVar21 != 0) {
                    auVar48 = vblendmps_avx512f(auVar45,auVar54);
                    bVar37 = (bool)((byte)uVar21 & 1);
                    local_a700._0_4_ = (uint)bVar37 * auVar48._0_4_ | (uint)!bVar37 * auVar54._0_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 1) & 1);
                    local_a700._4_4_ = (uint)bVar37 * auVar48._4_4_ | (uint)!bVar37 * auVar54._4_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 2) & 1);
                    local_a700._8_4_ = (uint)bVar37 * auVar48._8_4_ | (uint)!bVar37 * auVar54._8_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 3) & 1);
                    local_a700._12_4_ =
                         (uint)bVar37 * auVar48._12_4_ | (uint)!bVar37 * auVar54._12_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 4) & 1);
                    local_a700._16_4_ =
                         (uint)bVar37 * auVar48._16_4_ | (uint)!bVar37 * auVar54._16_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 5) & 1);
                    local_a700._20_4_ =
                         (uint)bVar37 * auVar48._20_4_ | (uint)!bVar37 * auVar54._20_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 6) & 1);
                    local_a700._24_4_ =
                         (uint)bVar37 * auVar48._24_4_ | (uint)!bVar37 * auVar54._24_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 7) & 1);
                    local_a700._28_4_ =
                         (uint)bVar37 * auVar48._28_4_ | (uint)!bVar37 * auVar54._28_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 8) & 1);
                    local_a700._32_4_ =
                         (uint)bVar37 * auVar48._32_4_ | (uint)!bVar37 * auVar54._32_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 9) & 1);
                    local_a700._36_4_ =
                         (uint)bVar37 * auVar48._36_4_ | (uint)!bVar37 * auVar54._36_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 10) & 1);
                    local_a700._40_4_ =
                         (uint)bVar37 * auVar48._40_4_ | (uint)!bVar37 * auVar54._40_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 0xb) & 1);
                    local_a700._44_4_ =
                         (uint)bVar37 * auVar48._44_4_ | (uint)!bVar37 * auVar54._44_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 0xc) & 1);
                    local_a700._48_4_ =
                         (uint)bVar37 * auVar48._48_4_ | (uint)!bVar37 * auVar54._48_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 0xd) & 1);
                    local_a700._52_4_ =
                         (uint)bVar37 * auVar48._52_4_ | (uint)!bVar37 * auVar54._52_4_;
                    bVar37 = (bool)((byte)(uVar21 >> 0xe) & 1);
                    local_a700._56_4_ =
                         (uint)bVar37 * auVar48._56_4_ | (uint)!bVar37 * auVar54._56_4_;
                    bVar37 = SUB81(uVar21 >> 0xf,0);
                    local_a700._60_4_ =
                         (uint)bVar37 * auVar48._60_4_ | (uint)!bVar37 * auVar54._60_4_;
                    uVar35 = uVar1;
                    if (uVar28 != 8) {
                      *puVar36 = uVar28;
                      puVar36 = puVar36 + 1;
                      *pauVar31 = auVar47;
                      pauVar31 = pauVar31 + 1;
                    }
                  }
                }
              } while ((uVar1 != 8) &&
                      (bVar37 = uVar34 < 7, uVar34 = uVar34 + 1, uVar28 = uVar35,
                      auVar47 = local_a700, bVar37));
              iVar39 = 0;
              if (uVar35 == 8) {
LAB_008e1170:
                bVar37 = false;
                iVar39 = 4;
              }
              else {
                auVar66._4_4_ = uStack_a07c;
                auVar66._0_4_ = local_a080;
                auVar66._8_4_ = uStack_a078;
                auVar66._12_4_ = uStack_a074;
                auVar66._16_4_ = uStack_a070;
                auVar66._20_4_ = uStack_a06c;
                auVar66._24_4_ = uStack_a068;
                auVar66._28_4_ = uStack_a064;
                auVar66._32_4_ = uStack_a060;
                auVar66._36_4_ = uStack_a05c;
                auVar66._40_4_ = uStack_a058;
                auVar66._44_4_ = uStack_a054;
                auVar66._48_4_ = uStack_a050;
                auVar66._52_4_ = uStack_a04c;
                auVar66._56_4_ = uStack_a048;
                auVar66._60_4_ = uStack_a044;
                uVar22 = vcmpps_avx512f(local_a700,auVar66,9);
                bVar37 = true;
                if ((uint)POPCOUNT((int)uVar22) <= (uint)local_a760) {
                  *puVar36 = uVar35;
                  puVar36 = puVar36 + 1;
                  *pauVar31 = local_a700;
                  pauVar31 = pauVar31 + 1;
                  goto LAB_008e1170;
                }
              }
              root.ptr = uVar35;
            } while (bVar37);
          }
        }
        goto LAB_008e1fc2;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar30 = local_a720 + 1;
    lVar33 = lVar33 + 0xe0;
    if (local_a728 <= uVar30) break;
LAB_008e11c1:
    local_a718 = uVar30 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    uVar34 = 0;
    local_a788 = lVar33;
    local_a76c = uVar26;
    local_a720 = uVar30;
    while( true ) {
      uVar29 = (ushort)uVar26;
      uVar30 = (ulong)*(uint *)(lVar33 + uVar34 * 4);
      if (uVar30 == 0xffffffff) break;
      auVar53 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0xc0 + uVar34 * 4)));
      auVar54 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0xb0 + uVar34 * 4)));
      auVar55 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0xa0 + uVar34 * 4)));
      local_a700 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0x90 + uVar34 * 4)));
      local_a680 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0x80 + uVar34 * 4)));
      local_9ec0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0x70 + uVar34 * 4)));
      local_9f00 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0x60 + uVar34 * 4)));
      local_9f40 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0x50 + uVar34 * 4)));
      local_9f80 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0x40 + uVar34 * 4)));
      local_9fc0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0x30 + uVar34 * 4)));
      local_a000 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0x20 + uVar34 * 4)));
      local_a040 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar33 + -0x10 + uVar34 * 4)));
      local_a710 = *(undefined8 *)(local_a718 + 0xd0);
      uStack_a708 = *(undefined8 *)(local_a718 + 0xd8);
      auVar47 = *(undefined1 (*) [64])ray;
      auVar48 = *(undefined1 (*) [64])(ray + 0x40);
      auVar49 = *(undefined1 (*) [64])(ray + 0x80);
      auVar50 = *(undefined1 (*) [64])(ray + 0x100);
      auVar51 = *(undefined1 (*) [64])(ray + 0x140);
      auVar52 = *(undefined1 (*) [64])(ray + 0x180);
      auVar56 = vsubps_avx512f(auVar53,auVar47);
      auVar57 = vsubps_avx512f(auVar54,auVar48);
      auVar55 = vsubps_avx512f(auVar55,auVar49);
      auVar53 = vsubps_avx512f(local_a700,auVar47);
      auVar54 = vsubps_avx512f(local_a680,auVar48);
      auVar58 = vsubps_avx512f(local_9ec0,auVar49);
      auVar47 = vsubps_avx512f(local_9fc0,auVar47);
      auVar48 = vsubps_avx512f(local_a000,auVar48);
      auVar49 = vsubps_avx512f(local_a040,auVar49);
      auVar59 = vsubps_avx512f(auVar47,auVar56);
      auVar60 = vsubps_avx512f(auVar48,auVar57);
      auVar61 = vsubps_avx512f(auVar49,auVar55);
      auVar62 = vsubps_avx512f(auVar56,auVar53);
      auVar63 = vsubps_avx512f(auVar57,auVar54);
      auVar64 = vsubps_avx512f(auVar55,auVar58);
      auVar65 = vaddps_avx512f(auVar47,auVar56);
      auVar66 = vaddps_avx512f(auVar48,auVar57);
      auVar67 = vaddps_avx512f(auVar49,auVar55);
      auVar68 = vmulps_avx512f(auVar66,auVar61);
      auVar68 = vfmsub231ps_avx512f(auVar68,auVar60,auVar67);
      auVar67 = vmulps_avx512f(auVar67,auVar59);
      auVar67 = vfmsub231ps_avx512f(auVar67,auVar61,auVar65);
      auVar65 = vmulps_avx512f(auVar65,auVar60);
      auVar65 = vfmsub231ps_avx512f(auVar65,auVar59,auVar66);
      auVar65 = vmulps_avx512f(auVar65,auVar52);
      auVar65 = vfmadd231ps_avx512f(auVar65,auVar51,auVar67);
      auVar65 = vfmadd231ps_avx512f(auVar65,auVar50,auVar68);
      auVar66 = vaddps_avx512f(auVar56,auVar53);
      auVar67 = vaddps_avx512f(auVar57,auVar54);
      auVar68 = vaddps_avx512f(auVar55,auVar58);
      auVar69 = vmulps_avx512f(auVar67,auVar64);
      auVar69 = vfmsub231ps_avx512f(auVar69,auVar63,auVar68);
      auVar68 = vmulps_avx512f(auVar68,auVar62);
      auVar68 = vfmsub231ps_avx512f(auVar68,auVar64,auVar66);
      auVar66 = vmulps_avx512f(auVar66,auVar63);
      auVar66 = vfmsub231ps_avx512f(auVar66,auVar62,auVar67);
      auVar67 = vsubps_avx512f(auVar53,auVar47);
      auVar66 = vmulps_avx512f(auVar66,auVar52);
      auVar66 = vfmadd231ps_avx512f(auVar66,auVar51,auVar68);
      auVar68 = vsubps_avx512f(auVar54,auVar48);
      auVar66 = vfmadd231ps_avx512f(auVar66,auVar50,auVar69);
      auVar69 = vsubps_avx512f(auVar58,auVar49);
      auVar47 = vaddps_avx512f(auVar53,auVar47);
      auVar48 = vaddps_avx512f(auVar54,auVar48);
      auVar49 = vaddps_avx512f(auVar58,auVar49);
      auVar53 = vmulps_avx512f(auVar48,auVar69);
      auVar53 = vfmsub231ps_avx512f(auVar53,auVar68,auVar49);
      auVar49 = vmulps_avx512f(auVar49,auVar67);
      auVar49 = vfmsub231ps_avx512f(auVar49,auVar69,auVar47);
      auVar47 = vmulps_avx512f(auVar47,auVar68);
      auVar47 = vfmsub231ps_avx512f(auVar47,auVar67,auVar48);
      auVar47 = vmulps_avx512f(auVar47,auVar52);
      auVar47 = vfmadd231ps_avx512f(auVar47,auVar51,auVar49);
      auVar47 = vfmadd231ps_avx512f(auVar47,auVar50,auVar53);
      auVar48 = vaddps_avx512f(auVar65,auVar66);
      auVar48 = vaddps_avx512f(auVar47,auVar48);
      auVar49 = vandps_avx512dq(auVar48,auVar42);
      auVar53._8_4_ = 0x34000000;
      auVar53._0_8_ = 0x3400000034000000;
      auVar53._12_4_ = 0x34000000;
      auVar53._16_4_ = 0x34000000;
      auVar53._20_4_ = 0x34000000;
      auVar53._24_4_ = 0x34000000;
      auVar53._28_4_ = 0x34000000;
      auVar53._32_4_ = 0x34000000;
      auVar53._36_4_ = 0x34000000;
      auVar53._40_4_ = 0x34000000;
      auVar53._44_4_ = 0x34000000;
      auVar53._48_4_ = 0x34000000;
      auVar53._52_4_ = 0x34000000;
      auVar53._56_4_ = 0x34000000;
      auVar53._60_4_ = 0x34000000;
      auVar53 = vmulps_avx512f(auVar49,auVar53);
      auVar54 = vminps_avx512f(auVar65,auVar66);
      auVar58 = vminps_avx512f(auVar54,auVar47);
      auVar54._8_4_ = 0x80000000;
      auVar54._0_8_ = 0x8000000080000000;
      auVar54._12_4_ = 0x80000000;
      auVar54._16_4_ = 0x80000000;
      auVar54._20_4_ = 0x80000000;
      auVar54._24_4_ = 0x80000000;
      auVar54._28_4_ = 0x80000000;
      auVar54._32_4_ = 0x80000000;
      auVar54._36_4_ = 0x80000000;
      auVar54._40_4_ = 0x80000000;
      auVar54._44_4_ = 0x80000000;
      auVar54._48_4_ = 0x80000000;
      auVar54._52_4_ = 0x80000000;
      auVar54._56_4_ = 0x80000000;
      auVar54._60_4_ = 0x80000000;
      auVar54 = vxorps_avx512dq(auVar53,auVar54);
      uVar22 = vcmpps_avx512f(auVar58,auVar54,5);
      auVar54 = vmaxps_avx512f(auVar65,auVar66);
      auVar47 = vmaxps_avx512f(auVar54,auVar47);
      uVar23 = vcmpps_avx512f(auVar47,auVar53,2);
      uVar29 = ((ushort)uVar22 | (ushort)uVar23) & uVar29;
      if (uVar29 != 0) {
        auVar47 = vmulps_avx512f(auVar63,auVar61);
        auVar53 = vmulps_avx512f(auVar59,auVar64);
        auVar54 = vmulps_avx512f(auVar62,auVar60);
        auVar58 = vmulps_avx512f(auVar68,auVar64);
        auVar70 = vmulps_avx512f(auVar62,auVar69);
        auVar71 = vmulps_avx512f(auVar67,auVar63);
        auVar60 = vfmsub213ps_avx512f(auVar60,auVar64,auVar47);
        auVar61 = vfmsub213ps_avx512f(auVar61,auVar62,auVar53);
        auVar59 = vfmsub213ps_avx512f(auVar59,auVar63,auVar54);
        auVar63 = vfmsub213ps_avx512f(auVar69,auVar63,auVar58);
        auVar64 = vfmsub213ps_avx512f(auVar67,auVar64,auVar70);
        auVar62 = vfmsub213ps_avx512f(auVar68,auVar62,auVar71);
        auVar47 = vandps_avx512dq(auVar47,auVar42);
        auVar58 = vandps_avx512dq(auVar58,auVar42);
        uVar28 = vcmpps_avx512f(auVar47,auVar58,1);
        auVar47 = vandps_avx512dq(auVar53,auVar42);
        auVar53 = vandps_avx512dq(auVar70,auVar42);
        uVar1 = vcmpps_avx512f(auVar47,auVar53,1);
        auVar47 = vandps_avx512dq(auVar54,auVar42);
        auVar53 = vandps_avx512dq(auVar71,auVar42);
        uVar35 = vcmpps_avx512f(auVar47,auVar53,1);
        bVar37 = (bool)((byte)uVar28 & 1);
        auVar58._0_4_ = (uint)bVar37 * auVar60._0_4_ | (uint)!bVar37 * auVar63._0_4_;
        bVar37 = (bool)((byte)(uVar28 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar37 * auVar60._4_4_ | (uint)!bVar37 * auVar63._4_4_;
        bVar37 = (bool)((byte)(uVar28 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar37 * auVar60._8_4_ | (uint)!bVar37 * auVar63._8_4_;
        bVar37 = (bool)((byte)(uVar28 >> 3) & 1);
        auVar58._12_4_ = (uint)bVar37 * auVar60._12_4_ | (uint)!bVar37 * auVar63._12_4_;
        bVar37 = (bool)((byte)(uVar28 >> 4) & 1);
        auVar58._16_4_ = (uint)bVar37 * auVar60._16_4_ | (uint)!bVar37 * auVar63._16_4_;
        bVar37 = (bool)((byte)(uVar28 >> 5) & 1);
        auVar58._20_4_ = (uint)bVar37 * auVar60._20_4_ | (uint)!bVar37 * auVar63._20_4_;
        bVar37 = (bool)((byte)(uVar28 >> 6) & 1);
        auVar58._24_4_ = (uint)bVar37 * auVar60._24_4_ | (uint)!bVar37 * auVar63._24_4_;
        bVar37 = (bool)((byte)(uVar28 >> 7) & 1);
        auVar58._28_4_ = (uint)bVar37 * auVar60._28_4_ | (uint)!bVar37 * auVar63._28_4_;
        bVar37 = (bool)((byte)(uVar28 >> 8) & 1);
        auVar58._32_4_ = (uint)bVar37 * auVar60._32_4_ | (uint)!bVar37 * auVar63._32_4_;
        bVar37 = (bool)((byte)(uVar28 >> 9) & 1);
        auVar58._36_4_ = (uint)bVar37 * auVar60._36_4_ | (uint)!bVar37 * auVar63._36_4_;
        bVar37 = (bool)((byte)(uVar28 >> 10) & 1);
        auVar58._40_4_ = (uint)bVar37 * auVar60._40_4_ | (uint)!bVar37 * auVar63._40_4_;
        bVar37 = (bool)((byte)(uVar28 >> 0xb) & 1);
        auVar58._44_4_ = (uint)bVar37 * auVar60._44_4_ | (uint)!bVar37 * auVar63._44_4_;
        bVar37 = (bool)((byte)(uVar28 >> 0xc) & 1);
        auVar58._48_4_ = (uint)bVar37 * auVar60._48_4_ | (uint)!bVar37 * auVar63._48_4_;
        bVar37 = (bool)((byte)(uVar28 >> 0xd) & 1);
        auVar58._52_4_ = (uint)bVar37 * auVar60._52_4_ | (uint)!bVar37 * auVar63._52_4_;
        bVar37 = (bool)((byte)(uVar28 >> 0xe) & 1);
        auVar58._56_4_ = (uint)bVar37 * auVar60._56_4_ | (uint)!bVar37 * auVar63._56_4_;
        bVar37 = SUB81(uVar28 >> 0xf,0);
        auVar58._60_4_ = (uint)bVar37 * auVar60._60_4_ | (uint)!bVar37 * auVar63._60_4_;
        bVar37 = (bool)((byte)uVar1 & 1);
        auVar60._0_4_ = (uint)bVar37 * auVar61._0_4_ | (uint)!bVar37 * auVar64._0_4_;
        bVar37 = (bool)((byte)(uVar1 >> 1) & 1);
        auVar60._4_4_ = (uint)bVar37 * auVar61._4_4_ | (uint)!bVar37 * auVar64._4_4_;
        bVar37 = (bool)((byte)(uVar1 >> 2) & 1);
        auVar60._8_4_ = (uint)bVar37 * auVar61._8_4_ | (uint)!bVar37 * auVar64._8_4_;
        bVar37 = (bool)((byte)(uVar1 >> 3) & 1);
        auVar60._12_4_ = (uint)bVar37 * auVar61._12_4_ | (uint)!bVar37 * auVar64._12_4_;
        bVar37 = (bool)((byte)(uVar1 >> 4) & 1);
        auVar60._16_4_ = (uint)bVar37 * auVar61._16_4_ | (uint)!bVar37 * auVar64._16_4_;
        bVar37 = (bool)((byte)(uVar1 >> 5) & 1);
        auVar60._20_4_ = (uint)bVar37 * auVar61._20_4_ | (uint)!bVar37 * auVar64._20_4_;
        bVar37 = (bool)((byte)(uVar1 >> 6) & 1);
        auVar60._24_4_ = (uint)bVar37 * auVar61._24_4_ | (uint)!bVar37 * auVar64._24_4_;
        bVar37 = (bool)((byte)(uVar1 >> 7) & 1);
        auVar60._28_4_ = (uint)bVar37 * auVar61._28_4_ | (uint)!bVar37 * auVar64._28_4_;
        bVar37 = (bool)((byte)(uVar1 >> 8) & 1);
        auVar60._32_4_ = (uint)bVar37 * auVar61._32_4_ | (uint)!bVar37 * auVar64._32_4_;
        bVar37 = (bool)((byte)(uVar1 >> 9) & 1);
        auVar60._36_4_ = (uint)bVar37 * auVar61._36_4_ | (uint)!bVar37 * auVar64._36_4_;
        bVar37 = (bool)((byte)(uVar1 >> 10) & 1);
        auVar60._40_4_ = (uint)bVar37 * auVar61._40_4_ | (uint)!bVar37 * auVar64._40_4_;
        bVar37 = (bool)((byte)(uVar1 >> 0xb) & 1);
        auVar60._44_4_ = (uint)bVar37 * auVar61._44_4_ | (uint)!bVar37 * auVar64._44_4_;
        bVar37 = (bool)((byte)(uVar1 >> 0xc) & 1);
        auVar60._48_4_ = (uint)bVar37 * auVar61._48_4_ | (uint)!bVar37 * auVar64._48_4_;
        bVar37 = (bool)((byte)(uVar1 >> 0xd) & 1);
        auVar60._52_4_ = (uint)bVar37 * auVar61._52_4_ | (uint)!bVar37 * auVar64._52_4_;
        bVar37 = (bool)((byte)(uVar1 >> 0xe) & 1);
        auVar60._56_4_ = (uint)bVar37 * auVar61._56_4_ | (uint)!bVar37 * auVar64._56_4_;
        bVar37 = SUB81(uVar1 >> 0xf,0);
        auVar60._60_4_ = (uint)bVar37 * auVar61._60_4_ | (uint)!bVar37 * auVar64._60_4_;
        bVar37 = (bool)((byte)uVar35 & 1);
        auVar61._0_4_ = (uint)bVar37 * auVar59._0_4_ | (uint)!bVar37 * auVar62._0_4_;
        bVar37 = (bool)((byte)(uVar35 >> 1) & 1);
        auVar61._4_4_ = (uint)bVar37 * auVar59._4_4_ | (uint)!bVar37 * auVar62._4_4_;
        bVar37 = (bool)((byte)(uVar35 >> 2) & 1);
        auVar61._8_4_ = (uint)bVar37 * auVar59._8_4_ | (uint)!bVar37 * auVar62._8_4_;
        bVar37 = (bool)((byte)(uVar35 >> 3) & 1);
        auVar61._12_4_ = (uint)bVar37 * auVar59._12_4_ | (uint)!bVar37 * auVar62._12_4_;
        bVar37 = (bool)((byte)(uVar35 >> 4) & 1);
        auVar61._16_4_ = (uint)bVar37 * auVar59._16_4_ | (uint)!bVar37 * auVar62._16_4_;
        bVar37 = (bool)((byte)(uVar35 >> 5) & 1);
        auVar61._20_4_ = (uint)bVar37 * auVar59._20_4_ | (uint)!bVar37 * auVar62._20_4_;
        bVar37 = (bool)((byte)(uVar35 >> 6) & 1);
        auVar61._24_4_ = (uint)bVar37 * auVar59._24_4_ | (uint)!bVar37 * auVar62._24_4_;
        bVar37 = (bool)((byte)(uVar35 >> 7) & 1);
        auVar61._28_4_ = (uint)bVar37 * auVar59._28_4_ | (uint)!bVar37 * auVar62._28_4_;
        bVar37 = (bool)((byte)(uVar35 >> 8) & 1);
        auVar61._32_4_ = (uint)bVar37 * auVar59._32_4_ | (uint)!bVar37 * auVar62._32_4_;
        bVar37 = (bool)((byte)(uVar35 >> 9) & 1);
        auVar61._36_4_ = (uint)bVar37 * auVar59._36_4_ | (uint)!bVar37 * auVar62._36_4_;
        bVar37 = (bool)((byte)(uVar35 >> 10) & 1);
        auVar61._40_4_ = (uint)bVar37 * auVar59._40_4_ | (uint)!bVar37 * auVar62._40_4_;
        bVar37 = (bool)((byte)(uVar35 >> 0xb) & 1);
        auVar61._44_4_ = (uint)bVar37 * auVar59._44_4_ | (uint)!bVar37 * auVar62._44_4_;
        bVar37 = (bool)((byte)(uVar35 >> 0xc) & 1);
        auVar61._48_4_ = (uint)bVar37 * auVar59._48_4_ | (uint)!bVar37 * auVar62._48_4_;
        bVar37 = (bool)((byte)(uVar35 >> 0xd) & 1);
        auVar61._52_4_ = (uint)bVar37 * auVar59._52_4_ | (uint)!bVar37 * auVar62._52_4_;
        bVar37 = (bool)((byte)(uVar35 >> 0xe) & 1);
        auVar61._56_4_ = (uint)bVar37 * auVar59._56_4_ | (uint)!bVar37 * auVar62._56_4_;
        bVar37 = SUB81(uVar35 >> 0xf,0);
        auVar61._60_4_ = (uint)bVar37 * auVar59._60_4_ | (uint)!bVar37 * auVar62._60_4_;
        auVar47 = vmulps_avx512f(auVar52,auVar61);
        auVar47 = vfmadd213ps_avx512f(auVar51,auVar60,auVar47);
        auVar47 = vfmadd213ps_avx512f(auVar50,auVar58,auVar47);
        auVar50 = vaddps_avx512f(auVar47,auVar47);
        auVar47 = vmulps_avx512f(auVar55,auVar61);
        auVar47 = vfmadd213ps_avx512f(auVar57,auVar60,auVar47);
        auVar47 = vfmadd213ps_avx512f(auVar56,auVar58,auVar47);
        auVar51 = vrcp14ps_avx512f(auVar50);
        auVar47 = vaddps_avx512f(auVar47,auVar47);
        auVar52 = vfnmadd213ps_avx512f(auVar51,auVar50,auVar44);
        auVar51 = vfmadd132ps_avx512f(auVar52,auVar51,auVar51);
        auVar51 = vmulps_avx512f(auVar47,auVar51);
        auVar47 = *(undefined1 (*) [64])(ray + 0x200);
        uVar22 = vcmpps_avx512f(auVar51,auVar47,2);
        uVar23 = vcmpps_avx512f(auVar51,*(undefined1 (*) [64])(ray + 0xc0),0xd);
        uVar24 = vcmpps_avx512f(auVar50,_DAT_020631c0,4);
        uVar29 = uVar29 & (ushort)uVar22 & (ushort)uVar23 & (ushort)uVar24;
        if (uVar29 != 0) {
          pGVar2 = (context->scene->geometries).items[uVar30].ptr;
          auVar50 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
          uVar22 = vptestmd_avx512f(auVar50,*(undefined1 (*) [64])(ray + 0x240));
          uVar29 = uVar29 & (ushort)uVar22;
          uVar27 = (uint)uVar29;
          lVar33 = local_a788;
          if (uVar29 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar30 = vcmpps_avx512f(auVar49,auVar43,5);
              auVar49 = vrcp14ps_avx512f(auVar48);
              auVar48 = vfnmadd213ps_avx512f(auVar48,auVar49,auVar44);
              auVar48 = vfmadd132ps_avx512f(auVar48,auVar49,auVar49);
              auVar50._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar48._4_4_;
              auVar50._0_4_ = (uint)((byte)uVar30 & 1) * auVar48._0_4_;
              auVar50._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar48._8_4_;
              auVar50._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar48._12_4_;
              auVar50._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar48._16_4_;
              auVar50._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar48._20_4_;
              auVar50._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar48._24_4_;
              auVar50._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar48._28_4_;
              auVar50._32_4_ = (uint)((byte)(uVar30 >> 8) & 1) * auVar48._32_4_;
              auVar50._36_4_ = (uint)((byte)(uVar30 >> 9) & 1) * auVar48._36_4_;
              auVar50._40_4_ = (uint)((byte)(uVar30 >> 10) & 1) * auVar48._40_4_;
              auVar50._44_4_ = (uint)((byte)(uVar30 >> 0xb) & 1) * auVar48._44_4_;
              auVar50._48_4_ = (uint)((byte)(uVar30 >> 0xc) & 1) * auVar48._48_4_;
              auVar50._52_4_ = (uint)((byte)(uVar30 >> 0xd) & 1) * auVar48._52_4_;
              auVar50._56_4_ = (uint)((byte)(uVar30 >> 0xe) & 1) * auVar48._56_4_;
              auVar50._60_4_ = (uint)(byte)(uVar30 >> 0xf) * auVar48._60_4_;
              auVar48 = vmulps_avx512f(auVar65,auVar50);
              local_a540 = vminps_avx512f(auVar48,auVar44);
              auVar48 = vmulps_avx512f(auVar66,auVar50);
              local_a500 = vminps_avx512f(auVar48,auVar44);
              pRVar3 = context->user;
              auVar48 = vpbroadcastd_avx512f();
              auVar49 = vpbroadcastd_avx512f();
              local_a600[0] = (RTCHitN)(char)auVar58._0_4_;
              local_a600[1] = (RTCHitN)(char)(auVar58._0_4_ >> 8);
              local_a600[2] = (RTCHitN)(char)(auVar58._0_4_ >> 0x10);
              local_a600[3] = (RTCHitN)(char)(auVar58._0_4_ >> 0x18);
              local_a600[4] = (RTCHitN)(char)auVar58._4_4_;
              local_a600[5] = (RTCHitN)(char)(auVar58._4_4_ >> 8);
              local_a600[6] = (RTCHitN)(char)(auVar58._4_4_ >> 0x10);
              local_a600[7] = (RTCHitN)(char)(auVar58._4_4_ >> 0x18);
              local_a600[8] = (RTCHitN)(char)auVar58._8_4_;
              local_a600[9] = (RTCHitN)(char)(auVar58._8_4_ >> 8);
              local_a600[10] = (RTCHitN)(char)(auVar58._8_4_ >> 0x10);
              local_a600[0xb] = (RTCHitN)(char)(auVar58._8_4_ >> 0x18);
              local_a600[0xc] = (RTCHitN)(char)auVar58._12_4_;
              local_a600[0xd] = (RTCHitN)(char)(auVar58._12_4_ >> 8);
              local_a600[0xe] = (RTCHitN)(char)(auVar58._12_4_ >> 0x10);
              local_a600[0xf] = (RTCHitN)(char)(auVar58._12_4_ >> 0x18);
              local_a600[0x10] = (RTCHitN)(char)auVar58._16_4_;
              local_a600[0x11] = (RTCHitN)(char)(auVar58._16_4_ >> 8);
              local_a600[0x12] = (RTCHitN)(char)(auVar58._16_4_ >> 0x10);
              local_a600[0x13] = (RTCHitN)(char)(auVar58._16_4_ >> 0x18);
              local_a600[0x14] = (RTCHitN)(char)auVar58._20_4_;
              local_a600[0x15] = (RTCHitN)(char)(auVar58._20_4_ >> 8);
              local_a600[0x16] = (RTCHitN)(char)(auVar58._20_4_ >> 0x10);
              local_a600[0x17] = (RTCHitN)(char)(auVar58._20_4_ >> 0x18);
              local_a600[0x18] = (RTCHitN)(char)auVar58._24_4_;
              local_a600[0x19] = (RTCHitN)(char)(auVar58._24_4_ >> 8);
              local_a600[0x1a] = (RTCHitN)(char)(auVar58._24_4_ >> 0x10);
              local_a600[0x1b] = (RTCHitN)(char)(auVar58._24_4_ >> 0x18);
              local_a600[0x1c] = (RTCHitN)(char)auVar58._28_4_;
              local_a600[0x1d] = (RTCHitN)(char)(auVar58._28_4_ >> 8);
              local_a600[0x1e] = (RTCHitN)(char)(auVar58._28_4_ >> 0x10);
              local_a600[0x1f] = (RTCHitN)(char)(auVar58._28_4_ >> 0x18);
              local_a600[0x20] = (RTCHitN)(char)auVar58._32_4_;
              local_a600[0x21] = (RTCHitN)(char)(auVar58._32_4_ >> 8);
              local_a600[0x22] = (RTCHitN)(char)(auVar58._32_4_ >> 0x10);
              local_a600[0x23] = (RTCHitN)(char)(auVar58._32_4_ >> 0x18);
              local_a600[0x24] = (RTCHitN)(char)auVar58._36_4_;
              local_a600[0x25] = (RTCHitN)(char)(auVar58._36_4_ >> 8);
              local_a600[0x26] = (RTCHitN)(char)(auVar58._36_4_ >> 0x10);
              local_a600[0x27] = (RTCHitN)(char)(auVar58._36_4_ >> 0x18);
              local_a600[0x28] = (RTCHitN)(char)auVar58._40_4_;
              local_a600[0x29] = (RTCHitN)(char)(auVar58._40_4_ >> 8);
              local_a600[0x2a] = (RTCHitN)(char)(auVar58._40_4_ >> 0x10);
              local_a600[0x2b] = (RTCHitN)(char)(auVar58._40_4_ >> 0x18);
              local_a600[0x2c] = (RTCHitN)(char)auVar58._44_4_;
              local_a600[0x2d] = (RTCHitN)(char)(auVar58._44_4_ >> 8);
              local_a600[0x2e] = (RTCHitN)(char)(auVar58._44_4_ >> 0x10);
              local_a600[0x2f] = (RTCHitN)(char)(auVar58._44_4_ >> 0x18);
              local_a600[0x30] = (RTCHitN)(char)auVar58._48_4_;
              local_a600[0x31] = (RTCHitN)(char)(auVar58._48_4_ >> 8);
              local_a600[0x32] = (RTCHitN)(char)(auVar58._48_4_ >> 0x10);
              local_a600[0x33] = (RTCHitN)(char)(auVar58._48_4_ >> 0x18);
              local_a600[0x34] = (RTCHitN)(char)auVar58._52_4_;
              local_a600[0x35] = (RTCHitN)(char)(auVar58._52_4_ >> 8);
              local_a600[0x36] = (RTCHitN)(char)(auVar58._52_4_ >> 0x10);
              local_a600[0x37] = (RTCHitN)(char)(auVar58._52_4_ >> 0x18);
              local_a600[0x38] = (RTCHitN)(char)auVar58._56_4_;
              local_a600[0x39] = (RTCHitN)(char)(auVar58._56_4_ >> 8);
              local_a600[0x3a] = (RTCHitN)(char)(auVar58._56_4_ >> 0x10);
              local_a600[0x3b] = (RTCHitN)(char)(auVar58._56_4_ >> 0x18);
              local_a600[0x3c] = (RTCHitN)(char)auVar58._60_4_;
              local_a600[0x3d] = (RTCHitN)(char)(auVar58._60_4_ >> 8);
              local_a600[0x3e] = (RTCHitN)(char)(auVar58._60_4_ >> 0x10);
              local_a600[0x3f] = (RTCHitN)(char)(auVar58._60_4_ >> 0x18);
              local_a5c0 = auVar60;
              local_a580 = auVar61;
              local_a4c0 = vmovdqa64_avx512f(auVar49);
              local_a480 = vmovdqa64_avx512f(auVar48);
              auVar40 = vpcmpeqd_avx2(local_a540._0_32_,local_a540._0_32_);
              local_a768[3] = auVar40;
              local_a768[2] = auVar40;
              local_a768[1] = auVar40;
              *local_a768 = auVar40;
              local_a440 = vbroadcastss_avx512f(ZEXT416(pRVar3->instID[0]));
              local_a400 = vbroadcastss_avx512f(ZEXT416(pRVar3->instPrimID[0]));
              auVar48 = vblendmps_avx512f(auVar47,auVar51);
              bVar37 = (bool)((byte)uVar29 & 1);
              bVar5 = (bool)((byte)(uVar29 >> 1) & 1);
              bVar6 = (bool)((byte)(uVar29 >> 2) & 1);
              bVar7 = (bool)((byte)(uVar29 >> 3) & 1);
              bVar8 = (bool)((byte)(uVar29 >> 4) & 1);
              bVar9 = (bool)((byte)(uVar29 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar29 >> 6) & 1);
              bVar11 = (bool)((byte)(uVar29 >> 7) & 1);
              bVar12 = (byte)(uVar29 >> 8);
              bVar13 = (bool)(bVar12 >> 1 & 1);
              bVar14 = (bool)(bVar12 >> 2 & 1);
              bVar15 = (bool)(bVar12 >> 3 & 1);
              bVar16 = (bool)(bVar12 >> 4 & 1);
              bVar17 = (bool)(bVar12 >> 5 & 1);
              bVar18 = (bool)(bVar12 >> 6 & 1);
              *(uint *)(ray + 0x200) =
                   (uint)bVar37 * auVar48._0_4_ | (uint)!bVar37 * local_a400._0_4_;
              *(uint *)(ray + 0x204) = (uint)bVar5 * auVar48._4_4_ | (uint)!bVar5 * local_a400._4_4_
              ;
              *(uint *)(ray + 0x208) = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * local_a400._8_4_
              ;
              *(uint *)(ray + 0x20c) =
                   (uint)bVar7 * auVar48._12_4_ | (uint)!bVar7 * local_a400._12_4_;
              *(uint *)(ray + 0x210) =
                   (uint)bVar8 * auVar48._16_4_ | (uint)!bVar8 * local_a400._16_4_;
              *(uint *)(ray + 0x214) =
                   (uint)bVar9 * auVar48._20_4_ | (uint)!bVar9 * local_a400._20_4_;
              *(uint *)(ray + 0x218) =
                   (uint)bVar10 * auVar48._24_4_ | (uint)!bVar10 * local_a400._24_4_;
              *(uint *)(ray + 0x21c) =
                   (uint)bVar11 * auVar48._28_4_ | (uint)!bVar11 * local_a400._28_4_;
              *(uint *)(ray + 0x220) =
                   (uint)(bVar12 & 1) * auVar48._32_4_ |
                   (uint)!(bool)(bVar12 & 1) * local_a400._32_4_;
              *(uint *)(ray + 0x224) =
                   (uint)bVar13 * auVar48._36_4_ | (uint)!bVar13 * local_a400._36_4_;
              *(uint *)(ray + 0x228) =
                   (uint)bVar14 * auVar48._40_4_ | (uint)!bVar14 * local_a400._40_4_;
              *(uint *)(ray + 0x22c) =
                   (uint)bVar15 * auVar48._44_4_ | (uint)!bVar15 * local_a400._44_4_;
              *(uint *)(ray + 0x230) =
                   (uint)bVar16 * auVar48._48_4_ | (uint)!bVar16 * local_a400._48_4_;
              *(uint *)(ray + 0x234) =
                   (uint)bVar17 * auVar48._52_4_ | (uint)!bVar17 * local_a400._52_4_;
              *(uint *)(ray + 0x238) =
                   (uint)bVar18 * auVar48._56_4_ | (uint)!bVar18 * local_a400._56_4_;
              *(uint *)(ray + 0x23c) =
                   (uint)(uVar29 >> 0xf) * auVar48._60_4_ |
                   (uint)!(bool)(bVar12 >> 7) * local_a400._60_4_;
              auVar48 = vpmovm2d_avx512dq((ulong)uVar27);
              local_a6c0 = vmovdqa64_avx512f(auVar48);
              local_a758.valid = (int *)local_a6c0;
              local_a758.geometryUserPtr = pGVar2->userPtr;
              local_a758.context = context->user;
              local_a758.hit = local_a600;
              local_a758.N = 0x10;
              local_a640 = auVar47;
              uVar30 = uVar38;
              local_a758.ray = (RTCRayN *)ray;
              if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                local_a780 = ray;
                (*pGVar2->occlusionFilterN)(&local_a758);
                auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                uVar30 = uVar38 & 0xffffffff;
                auVar45 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar43 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
                auVar42 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                ray = local_a780;
              }
              auVar47 = vmovdqa64_avx512f(local_a6c0);
              uVar28 = vptestmd_avx512f(auVar47,auVar47);
              if ((short)uVar28 != 0) {
                p_Var4 = context->args->filter;
                if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var4)(&local_a758);
                  auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  uVar30 = uVar38 & 0xffffffff;
                  auVar45 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                  auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar43 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
                  auVar42 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                }
                auVar47 = vmovdqa64_avx512f(local_a6c0);
                uVar28 = vptestmd_avx512f(auVar47,auVar47);
                auVar47 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar37 = (bool)((byte)uVar28 & 1);
                bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
                bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
                bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
                bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
                bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
                bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
                bVar13 = (bool)((byte)(uVar28 >> 8) & 1);
                bVar14 = (bool)((byte)(uVar28 >> 9) & 1);
                bVar15 = (bool)((byte)(uVar28 >> 10) & 1);
                bVar16 = (bool)((byte)(uVar28 >> 0xb) & 1);
                bVar17 = (bool)((byte)(uVar28 >> 0xc) & 1);
                bVar18 = (bool)((byte)(uVar28 >> 0xd) & 1);
                bVar19 = (bool)((byte)(uVar28 >> 0xe) & 1);
                bVar20 = SUB81(uVar28 >> 0xf,0);
                *(uint *)(local_a758.ray + 0x200) =
                     (uint)bVar37 * auVar47._0_4_ | (uint)!bVar37 * *(int *)(local_a758.ray + 0x200)
                ;
                *(uint *)(local_a758.ray + 0x204) =
                     (uint)bVar5 * auVar47._4_4_ | (uint)!bVar5 * *(int *)(local_a758.ray + 0x204);
                *(uint *)(local_a758.ray + 0x208) =
                     (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * *(int *)(local_a758.ray + 0x208);
                *(uint *)(local_a758.ray + 0x20c) =
                     (uint)bVar7 * auVar47._12_4_ | (uint)!bVar7 * *(int *)(local_a758.ray + 0x20c);
                *(uint *)(local_a758.ray + 0x210) =
                     (uint)bVar8 * auVar47._16_4_ | (uint)!bVar8 * *(int *)(local_a758.ray + 0x210);
                *(uint *)(local_a758.ray + 0x214) =
                     (uint)bVar9 * auVar47._20_4_ | (uint)!bVar9 * *(int *)(local_a758.ray + 0x214);
                *(uint *)(local_a758.ray + 0x218) =
                     (uint)bVar10 * auVar47._24_4_ |
                     (uint)!bVar10 * *(int *)(local_a758.ray + 0x218);
                *(uint *)(local_a758.ray + 0x21c) =
                     (uint)bVar11 * auVar47._28_4_ |
                     (uint)!bVar11 * *(int *)(local_a758.ray + 0x21c);
                *(uint *)(local_a758.ray + 0x220) =
                     (uint)bVar13 * auVar47._32_4_ |
                     (uint)!bVar13 * *(int *)(local_a758.ray + 0x220);
                *(uint *)(local_a758.ray + 0x224) =
                     (uint)bVar14 * auVar47._36_4_ |
                     (uint)!bVar14 * *(int *)(local_a758.ray + 0x224);
                *(uint *)(local_a758.ray + 0x228) =
                     (uint)bVar15 * auVar47._40_4_ |
                     (uint)!bVar15 * *(int *)(local_a758.ray + 0x228);
                *(uint *)(local_a758.ray + 0x22c) =
                     (uint)bVar16 * auVar47._44_4_ |
                     (uint)!bVar16 * *(int *)(local_a758.ray + 0x22c);
                *(uint *)(local_a758.ray + 0x230) =
                     (uint)bVar17 * auVar47._48_4_ |
                     (uint)!bVar17 * *(int *)(local_a758.ray + 0x230);
                *(uint *)(local_a758.ray + 0x234) =
                     (uint)bVar18 * auVar47._52_4_ |
                     (uint)!bVar18 * *(int *)(local_a758.ray + 0x234);
                *(uint *)(local_a758.ray + 0x238) =
                     (uint)bVar19 * auVar47._56_4_ |
                     (uint)!bVar19 * *(int *)(local_a758.ray + 0x238);
                *(uint *)(local_a758.ray + 0x23c) =
                     (uint)bVar20 * auVar47._60_4_ |
                     (uint)!bVar20 * *(int *)(local_a758.ray + 0x23c);
              }
              uVar27 = (uint)uVar28;
              bVar37 = (bool)((byte)uVar28 & 1);
              bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
              bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
              bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
              bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
              bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
              bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
              bVar13 = (bool)((byte)(uVar28 >> 8) & 1);
              bVar14 = (bool)((byte)(uVar28 >> 9) & 1);
              bVar15 = (bool)((byte)(uVar28 >> 10) & 1);
              bVar16 = (bool)((byte)(uVar28 >> 0xb) & 1);
              bVar17 = (bool)((byte)(uVar28 >> 0xc) & 1);
              bVar18 = (bool)((byte)(uVar28 >> 0xd) & 1);
              bVar19 = (bool)((byte)(uVar28 >> 0xe) & 1);
              bVar20 = SUB81(uVar28 >> 0xf,0);
              *(uint *)local_a778 =
                   (uint)bVar37 * *(int *)local_a778 | (uint)!bVar37 * local_a640._0_4_;
              *(uint *)(local_a778 + 4) =
                   (uint)bVar5 * *(int *)(local_a778 + 4) | (uint)!bVar5 * local_a640._4_4_;
              *(uint *)(local_a778 + 8) =
                   (uint)bVar6 * *(int *)(local_a778 + 8) | (uint)!bVar6 * local_a640._8_4_;
              *(uint *)(local_a778 + 0xc) =
                   (uint)bVar7 * *(int *)(local_a778 + 0xc) | (uint)!bVar7 * local_a640._12_4_;
              *(uint *)(local_a778 + 0x10) =
                   (uint)bVar8 * *(int *)(local_a778 + 0x10) | (uint)!bVar8 * local_a640._16_4_;
              *(uint *)(local_a778 + 0x14) =
                   (uint)bVar9 * *(int *)(local_a778 + 0x14) | (uint)!bVar9 * local_a640._20_4_;
              *(uint *)(local_a778 + 0x18) =
                   (uint)bVar10 * *(int *)(local_a778 + 0x18) | (uint)!bVar10 * local_a640._24_4_;
              *(uint *)(local_a778 + 0x1c) =
                   (uint)bVar11 * *(int *)(local_a778 + 0x1c) | (uint)!bVar11 * local_a640._28_4_;
              *(uint *)(local_a778 + 0x20) =
                   (uint)bVar13 * *(int *)(local_a778 + 0x20) | (uint)!bVar13 * local_a640._32_4_;
              *(uint *)(local_a778 + 0x24) =
                   (uint)bVar14 * *(int *)(local_a778 + 0x24) | (uint)!bVar14 * local_a640._36_4_;
              *(uint *)(local_a778 + 0x28) =
                   (uint)bVar15 * *(int *)(local_a778 + 0x28) | (uint)!bVar15 * local_a640._40_4_;
              *(uint *)(local_a778 + 0x2c) =
                   (uint)bVar16 * *(int *)(local_a778 + 0x2c) | (uint)!bVar16 * local_a640._44_4_;
              *(uint *)(local_a778 + 0x30) =
                   (uint)bVar17 * *(int *)(local_a778 + 0x30) | (uint)!bVar17 * local_a640._48_4_;
              *(uint *)(local_a778 + 0x34) =
                   (uint)bVar18 * *(int *)(local_a778 + 0x34) | (uint)!bVar18 * local_a640._52_4_;
              *(uint *)(local_a778 + 0x38) =
                   (uint)bVar19 * *(int *)(local_a778 + 0x38) | (uint)!bVar19 * local_a640._56_4_;
              *(uint *)(local_a778 + 0x3c) =
                   (uint)bVar20 * *(int *)(local_a778 + 0x3c) | (uint)!bVar20 * local_a640._60_4_;
              uVar38 = uVar30;
            }
            uVar26 = ~uVar27 & uVar26;
            lVar33 = local_a788;
          }
        }
      }
      if ((ushort)uVar26 == 0) {
        bVar37 = false;
      }
      else {
        auVar41 = *(undefined1 (*) [64])ray;
        auVar47 = *(undefined1 (*) [64])(ray + 0x40);
        auVar48 = *(undefined1 (*) [64])(ray + 0x80);
        auVar49 = *(undefined1 (*) [64])(ray + 0x100);
        auVar50 = *(undefined1 (*) [64])(ray + 0x140);
        auVar51 = *(undefined1 (*) [64])(ray + 0x180);
        auVar53 = vsubps_avx512f(local_9f00,auVar41);
        auVar54 = vsubps_avx512f(local_9f40,auVar47);
        auVar55 = vsubps_avx512f(local_9f80,auVar48);
        auVar52 = vsubps_avx512f(local_9fc0,auVar41);
        auVar56 = vsubps_avx512f(local_a000,auVar47);
        auVar57 = vsubps_avx512f(local_a040,auVar48);
        auVar41 = vsubps_avx512f(local_a700,auVar41);
        auVar47 = vsubps_avx512f(local_a680,auVar47);
        auVar48 = vsubps_avx512f(local_9ec0,auVar48);
        auVar58 = vsubps_avx512f(auVar41,auVar53);
        auVar59 = vsubps_avx512f(auVar47,auVar54);
        auVar60 = vsubps_avx512f(auVar48,auVar55);
        auVar61 = vsubps_avx512f(auVar53,auVar52);
        auVar62 = vsubps_avx512f(auVar54,auVar56);
        auVar63 = vsubps_avx512f(auVar55,auVar57);
        auVar64 = vsubps_avx512f(auVar52,auVar41);
        auVar65 = vsubps_avx512f(auVar56,auVar47);
        auVar66 = vsubps_avx512f(auVar57,auVar48);
        auVar67 = vaddps_avx512f(auVar41,auVar53);
        auVar68 = vaddps_avx512f(auVar47,auVar54);
        auVar69 = vaddps_avx512f(auVar48,auVar55);
        auVar70 = vmulps_avx512f(auVar68,auVar60);
        auVar70 = vfmsub231ps_avx512f(auVar70,auVar59,auVar69);
        auVar69 = vmulps_avx512f(auVar69,auVar58);
        auVar69 = vfmsub231ps_avx512f(auVar69,auVar60,auVar67);
        auVar67 = vmulps_avx512f(auVar67,auVar59);
        auVar67 = vfmsub231ps_avx512f(auVar67,auVar58,auVar68);
        auVar67 = vmulps_avx512f(auVar67,auVar51);
        auVar67 = vfmadd231ps_avx512f(auVar67,auVar50,auVar69);
        auVar67 = vfmadd231ps_avx512f(auVar67,auVar49,auVar70);
        auVar68 = vaddps_avx512f(auVar53,auVar52);
        auVar69 = vaddps_avx512f(auVar54,auVar56);
        auVar70 = vaddps_avx512f(auVar55,auVar57);
        auVar71 = vmulps_avx512f(auVar69,auVar63);
        auVar71 = vfmsub231ps_avx512f(auVar71,auVar62,auVar70);
        auVar70 = vmulps_avx512f(auVar70,auVar61);
        auVar70 = vfmsub231ps_avx512f(auVar70,auVar63,auVar68);
        auVar68 = vmulps_avx512f(auVar68,auVar62);
        auVar68 = vfmsub231ps_avx512f(auVar68,auVar61,auVar69);
        auVar68 = vmulps_avx512f(auVar68,auVar51);
        auVar68 = vfmadd231ps_avx512f(auVar68,auVar50,auVar70);
        auVar68 = vfmadd231ps_avx512f(auVar68,auVar49,auVar71);
        auVar41 = vaddps_avx512f(auVar52,auVar41);
        auVar47 = vaddps_avx512f(auVar56,auVar47);
        auVar48 = vaddps_avx512f(auVar57,auVar48);
        auVar52 = vmulps_avx512f(auVar47,auVar66);
        auVar52 = vfmsub231ps_avx512f(auVar52,auVar65,auVar48);
        auVar48 = vmulps_avx512f(auVar48,auVar64);
        auVar48 = vfmsub231ps_avx512f(auVar48,auVar66,auVar41);
        auVar41 = vmulps_avx512f(auVar41,auVar65);
        auVar41 = vfmsub231ps_avx512f(auVar41,auVar64,auVar47);
        auVar41 = vmulps_avx512f(auVar41,auVar51);
        auVar41 = vfmadd231ps_avx512f(auVar41,auVar50,auVar48);
        auVar47 = vfmadd231ps_avx512f(auVar41,auVar49,auVar52);
        auVar41 = vaddps_avx512f(auVar67,auVar68);
        auVar48 = vaddps_avx512f(auVar47,auVar41);
        auVar56 = vandps_avx512dq(auVar48,auVar42);
        auVar41._8_4_ = 0x34000000;
        auVar41._0_8_ = 0x3400000034000000;
        auVar41._12_4_ = 0x34000000;
        auVar41._16_4_ = 0x34000000;
        auVar41._20_4_ = 0x34000000;
        auVar41._24_4_ = 0x34000000;
        auVar41._28_4_ = 0x34000000;
        auVar41._32_4_ = 0x34000000;
        auVar41._36_4_ = 0x34000000;
        auVar41._40_4_ = 0x34000000;
        auVar41._44_4_ = 0x34000000;
        auVar41._48_4_ = 0x34000000;
        auVar41._52_4_ = 0x34000000;
        auVar41._56_4_ = 0x34000000;
        auVar41._60_4_ = 0x34000000;
        auVar41 = vmulps_avx512f(auVar56,auVar41);
        auVar52 = vminps_avx512f(auVar67,auVar68);
        auVar57 = vminps_avx512f(auVar52,auVar47);
        auVar52._8_4_ = 0x80000000;
        auVar52._0_8_ = 0x8000000080000000;
        auVar52._12_4_ = 0x80000000;
        auVar52._16_4_ = 0x80000000;
        auVar52._20_4_ = 0x80000000;
        auVar52._24_4_ = 0x80000000;
        auVar52._28_4_ = 0x80000000;
        auVar52._32_4_ = 0x80000000;
        auVar52._36_4_ = 0x80000000;
        auVar52._40_4_ = 0x80000000;
        auVar52._44_4_ = 0x80000000;
        auVar52._48_4_ = 0x80000000;
        auVar52._52_4_ = 0x80000000;
        auVar52._56_4_ = 0x80000000;
        auVar52._60_4_ = 0x80000000;
        auVar52 = vxorps_avx512dq(auVar41,auVar52);
        uVar22 = vcmpps_avx512f(auVar57,auVar52,5);
        auVar52 = vmaxps_avx512f(auVar67,auVar68);
        auVar47 = vmaxps_avx512f(auVar52,auVar47);
        uVar23 = vcmpps_avx512f(auVar47,auVar41,2);
        uVar29 = ((ushort)uVar22 | (ushort)uVar23) & (ushort)uVar26;
        if (uVar29 == 0) {
          auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
        }
        else {
          auVar41 = vmulps_avx512f(auVar62,auVar60);
          auVar47 = vmulps_avx512f(auVar58,auVar63);
          auVar52 = vmulps_avx512f(auVar61,auVar59);
          auVar57 = vmulps_avx512f(auVar65,auVar63);
          auVar69 = vmulps_avx512f(auVar61,auVar66);
          auVar70 = vmulps_avx512f(auVar64,auVar62);
          auVar59 = vfmsub213ps_avx512f(auVar59,auVar63,auVar41);
          auVar60 = vfmsub213ps_avx512f(auVar60,auVar61,auVar47);
          auVar58 = vfmsub213ps_avx512f(auVar58,auVar62,auVar52);
          auVar62 = vfmsub213ps_avx512f(auVar66,auVar62,auVar57);
          auVar63 = vfmsub213ps_avx512f(auVar64,auVar63,auVar69);
          auVar61 = vfmsub213ps_avx512f(auVar65,auVar61,auVar70);
          auVar41 = vandps_avx512dq(auVar41,auVar42);
          auVar57 = vandps_avx512dq(auVar57,auVar42);
          uVar30 = vcmpps_avx512f(auVar41,auVar57,1);
          auVar41 = vandps_avx512dq(auVar47,auVar42);
          auVar47 = vandps_avx512dq(auVar69,auVar42);
          uVar28 = vcmpps_avx512f(auVar41,auVar47,1);
          auVar41 = vandps_avx512dq(auVar52,auVar42);
          auVar47 = vandps_avx512dq(auVar70,auVar42);
          uVar1 = vcmpps_avx512f(auVar41,auVar47,1);
          bVar37 = (bool)((byte)uVar30 & 1);
          auVar57._0_4_ = (uint)bVar37 * auVar59._0_4_ | (uint)!bVar37 * auVar62._0_4_;
          bVar37 = (bool)((byte)(uVar30 >> 1) & 1);
          auVar57._4_4_ = (uint)bVar37 * auVar59._4_4_ | (uint)!bVar37 * auVar62._4_4_;
          bVar37 = (bool)((byte)(uVar30 >> 2) & 1);
          auVar57._8_4_ = (uint)bVar37 * auVar59._8_4_ | (uint)!bVar37 * auVar62._8_4_;
          bVar37 = (bool)((byte)(uVar30 >> 3) & 1);
          auVar57._12_4_ = (uint)bVar37 * auVar59._12_4_ | (uint)!bVar37 * auVar62._12_4_;
          bVar37 = (bool)((byte)(uVar30 >> 4) & 1);
          auVar57._16_4_ = (uint)bVar37 * auVar59._16_4_ | (uint)!bVar37 * auVar62._16_4_;
          bVar37 = (bool)((byte)(uVar30 >> 5) & 1);
          auVar57._20_4_ = (uint)bVar37 * auVar59._20_4_ | (uint)!bVar37 * auVar62._20_4_;
          bVar37 = (bool)((byte)(uVar30 >> 6) & 1);
          auVar57._24_4_ = (uint)bVar37 * auVar59._24_4_ | (uint)!bVar37 * auVar62._24_4_;
          bVar37 = (bool)((byte)(uVar30 >> 7) & 1);
          auVar57._28_4_ = (uint)bVar37 * auVar59._28_4_ | (uint)!bVar37 * auVar62._28_4_;
          bVar37 = (bool)((byte)(uVar30 >> 8) & 1);
          auVar57._32_4_ = (uint)bVar37 * auVar59._32_4_ | (uint)!bVar37 * auVar62._32_4_;
          bVar37 = (bool)((byte)(uVar30 >> 9) & 1);
          auVar57._36_4_ = (uint)bVar37 * auVar59._36_4_ | (uint)!bVar37 * auVar62._36_4_;
          bVar37 = (bool)((byte)(uVar30 >> 10) & 1);
          auVar57._40_4_ = (uint)bVar37 * auVar59._40_4_ | (uint)!bVar37 * auVar62._40_4_;
          bVar37 = (bool)((byte)(uVar30 >> 0xb) & 1);
          auVar57._44_4_ = (uint)bVar37 * auVar59._44_4_ | (uint)!bVar37 * auVar62._44_4_;
          bVar37 = (bool)((byte)(uVar30 >> 0xc) & 1);
          auVar57._48_4_ = (uint)bVar37 * auVar59._48_4_ | (uint)!bVar37 * auVar62._48_4_;
          bVar37 = (bool)((byte)(uVar30 >> 0xd) & 1);
          auVar57._52_4_ = (uint)bVar37 * auVar59._52_4_ | (uint)!bVar37 * auVar62._52_4_;
          bVar37 = (bool)((byte)(uVar30 >> 0xe) & 1);
          auVar57._56_4_ = (uint)bVar37 * auVar59._56_4_ | (uint)!bVar37 * auVar62._56_4_;
          bVar37 = SUB81(uVar30 >> 0xf,0);
          auVar57._60_4_ = (uint)bVar37 * auVar59._60_4_ | (uint)!bVar37 * auVar62._60_4_;
          bVar37 = (bool)((byte)uVar28 & 1);
          auVar40._0_4_ = (uint)bVar37 * auVar60._0_4_ | (uint)!bVar37 * auVar63._0_4_;
          bVar37 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar40._4_4_ = (uint)bVar37 * auVar60._4_4_ | (uint)!bVar37 * auVar63._4_4_;
          bVar37 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar40._8_4_ = (uint)bVar37 * auVar60._8_4_ | (uint)!bVar37 * auVar63._8_4_;
          bVar37 = (bool)((byte)(uVar28 >> 3) & 1);
          auVar40._12_4_ = (uint)bVar37 * auVar60._12_4_ | (uint)!bVar37 * auVar63._12_4_;
          bVar37 = (bool)((byte)(uVar28 >> 4) & 1);
          auVar40._16_4_ = (uint)bVar37 * auVar60._16_4_ | (uint)!bVar37 * auVar63._16_4_;
          bVar37 = (bool)((byte)(uVar28 >> 5) & 1);
          auVar40._20_4_ = (uint)bVar37 * auVar60._20_4_ | (uint)!bVar37 * auVar63._20_4_;
          bVar37 = (bool)((byte)(uVar28 >> 6) & 1);
          auVar40._24_4_ = (uint)bVar37 * auVar60._24_4_ | (uint)!bVar37 * auVar63._24_4_;
          bVar37 = (bool)((byte)(uVar28 >> 7) & 1);
          auVar40._28_4_ = (uint)bVar37 * auVar60._28_4_ | (uint)!bVar37 * auVar63._28_4_;
          bVar37 = (bool)((byte)(uVar28 >> 8) & 1);
          auVar59._32_4_ = (uint)bVar37 * auVar60._32_4_ | (uint)!bVar37 * auVar63._32_4_;
          auVar59._0_32_ = auVar40;
          bVar37 = (bool)((byte)(uVar28 >> 9) & 1);
          auVar59._36_4_ = (uint)bVar37 * auVar60._36_4_ | (uint)!bVar37 * auVar63._36_4_;
          bVar37 = (bool)((byte)(uVar28 >> 10) & 1);
          auVar59._40_4_ = (uint)bVar37 * auVar60._40_4_ | (uint)!bVar37 * auVar63._40_4_;
          bVar37 = (bool)((byte)(uVar28 >> 0xb) & 1);
          auVar59._44_4_ = (uint)bVar37 * auVar60._44_4_ | (uint)!bVar37 * auVar63._44_4_;
          bVar37 = (bool)((byte)(uVar28 >> 0xc) & 1);
          auVar59._48_4_ = (uint)bVar37 * auVar60._48_4_ | (uint)!bVar37 * auVar63._48_4_;
          bVar37 = (bool)((byte)(uVar28 >> 0xd) & 1);
          auVar59._52_4_ = (uint)bVar37 * auVar60._52_4_ | (uint)!bVar37 * auVar63._52_4_;
          bVar37 = (bool)((byte)(uVar28 >> 0xe) & 1);
          auVar59._56_4_ = (uint)bVar37 * auVar60._56_4_ | (uint)!bVar37 * auVar63._56_4_;
          bVar37 = SUB81(uVar28 >> 0xf,0);
          auVar59._60_4_ = (uint)bVar37 * auVar60._60_4_ | (uint)!bVar37 * auVar63._60_4_;
          bVar37 = (bool)((byte)uVar1 & 1);
          auVar62._0_4_ = (uint)bVar37 * auVar58._0_4_ | (uint)!bVar37 * auVar61._0_4_;
          bVar37 = (bool)((byte)(uVar1 >> 1) & 1);
          auVar62._4_4_ = (uint)bVar37 * auVar58._4_4_ | (uint)!bVar37 * auVar61._4_4_;
          bVar37 = (bool)((byte)(uVar1 >> 2) & 1);
          auVar62._8_4_ = (uint)bVar37 * auVar58._8_4_ | (uint)!bVar37 * auVar61._8_4_;
          bVar37 = (bool)((byte)(uVar1 >> 3) & 1);
          auVar62._12_4_ = (uint)bVar37 * auVar58._12_4_ | (uint)!bVar37 * auVar61._12_4_;
          bVar37 = (bool)((byte)(uVar1 >> 4) & 1);
          auVar62._16_4_ = (uint)bVar37 * auVar58._16_4_ | (uint)!bVar37 * auVar61._16_4_;
          bVar37 = (bool)((byte)(uVar1 >> 5) & 1);
          auVar62._20_4_ = (uint)bVar37 * auVar58._20_4_ | (uint)!bVar37 * auVar61._20_4_;
          bVar37 = (bool)((byte)(uVar1 >> 6) & 1);
          auVar62._24_4_ = (uint)bVar37 * auVar58._24_4_ | (uint)!bVar37 * auVar61._24_4_;
          bVar37 = (bool)((byte)(uVar1 >> 7) & 1);
          auVar62._28_4_ = (uint)bVar37 * auVar58._28_4_ | (uint)!bVar37 * auVar61._28_4_;
          bVar37 = (bool)((byte)(uVar1 >> 8) & 1);
          auVar62._32_4_ = (uint)bVar37 * auVar58._32_4_ | (uint)!bVar37 * auVar61._32_4_;
          bVar37 = (bool)((byte)(uVar1 >> 9) & 1);
          auVar62._36_4_ = (uint)bVar37 * auVar58._36_4_ | (uint)!bVar37 * auVar61._36_4_;
          bVar37 = (bool)((byte)(uVar1 >> 10) & 1);
          auVar62._40_4_ = (uint)bVar37 * auVar58._40_4_ | (uint)!bVar37 * auVar61._40_4_;
          bVar37 = (bool)((byte)(uVar1 >> 0xb) & 1);
          auVar62._44_4_ = (uint)bVar37 * auVar58._44_4_ | (uint)!bVar37 * auVar61._44_4_;
          bVar37 = (bool)((byte)(uVar1 >> 0xc) & 1);
          auVar62._48_4_ = (uint)bVar37 * auVar58._48_4_ | (uint)!bVar37 * auVar61._48_4_;
          bVar37 = (bool)((byte)(uVar1 >> 0xd) & 1);
          auVar62._52_4_ = (uint)bVar37 * auVar58._52_4_ | (uint)!bVar37 * auVar61._52_4_;
          bVar37 = (bool)((byte)(uVar1 >> 0xe) & 1);
          auVar62._56_4_ = (uint)bVar37 * auVar58._56_4_ | (uint)!bVar37 * auVar61._56_4_;
          bVar37 = SUB81(uVar1 >> 0xf,0);
          auVar62._60_4_ = (uint)bVar37 * auVar58._60_4_ | (uint)!bVar37 * auVar61._60_4_;
          auVar41 = vmulps_avx512f(auVar51,auVar62);
          auVar41 = vfmadd213ps_avx512f(auVar50,auVar59,auVar41);
          auVar41 = vfmadd213ps_avx512f(auVar49,auVar57,auVar41);
          auVar41 = vaddps_avx512f(auVar41,auVar41);
          auVar47 = vmulps_avx512f(auVar55,auVar62);
          auVar47 = vfmadd213ps_avx512f(auVar54,auVar59,auVar47);
          auVar47 = vfmadd213ps_avx512f(auVar53,auVar57,auVar47);
          auVar49 = vrcp14ps_avx512f(auVar41);
          auVar47 = vaddps_avx512f(auVar47,auVar47);
          auVar50 = vfnmadd213ps_avx512f(auVar49,auVar41,auVar44);
          auVar49 = vfmadd132ps_avx512f(auVar50,auVar49,auVar49);
          auVar49 = vmulps_avx512f(auVar47,auVar49);
          auVar47 = *(undefined1 (*) [64])(ray + 0x200);
          uVar22 = vcmpps_avx512f(auVar49,auVar47,2);
          uVar23 = vcmpps_avx512f(auVar49,*(undefined1 (*) [64])(ray + 0xc0),0xd);
          uVar24 = vcmpps_avx512f(auVar41,_DAT_020631c0,4);
          uVar29 = uVar29 & (ushort)uVar22 & (ushort)uVar23 & (ushort)uVar24;
          auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
          if (uVar29 != 0) {
            pGVar2 = (context->scene->geometries).items[*(uint *)(lVar33 + uVar34 * 4)].ptr;
            local_a700._0_8_ = pGVar2;
            auVar50 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
            uVar22 = vptestmd_avx512f(auVar50,*(undefined1 (*) [64])(ray + 0x240));
            uVar29 = uVar29 & (ushort)uVar22;
            uVar27 = (uint)uVar29;
            if (uVar29 != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar50 = vrcp14ps_avx512f(auVar48);
                uVar30 = vcmpps_avx512f(auVar56,auVar43,5);
                auVar48 = vfnmadd213ps_avx512f(auVar48,auVar50,auVar44);
                auVar48 = vfmadd132ps_avx512f(auVar48,auVar50,auVar50);
                auVar51._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar48._4_4_;
                auVar51._0_4_ = (uint)((byte)uVar30 & 1) * auVar48._0_4_;
                auVar51._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar48._8_4_;
                auVar51._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar48._12_4_;
                auVar51._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar48._16_4_;
                auVar51._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar48._20_4_;
                auVar51._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar48._24_4_;
                auVar51._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar48._28_4_;
                auVar51._32_4_ = (uint)((byte)(uVar30 >> 8) & 1) * auVar48._32_4_;
                auVar51._36_4_ = (uint)((byte)(uVar30 >> 9) & 1) * auVar48._36_4_;
                auVar51._40_4_ = (uint)((byte)(uVar30 >> 10) & 1) * auVar48._40_4_;
                auVar51._44_4_ = (uint)((byte)(uVar30 >> 0xb) & 1) * auVar48._44_4_;
                auVar51._48_4_ = (uint)((byte)(uVar30 >> 0xc) & 1) * auVar48._48_4_;
                auVar51._52_4_ = (uint)((byte)(uVar30 >> 0xd) & 1) * auVar48._52_4_;
                auVar51._56_4_ = (uint)((byte)(uVar30 >> 0xe) & 1) * auVar48._56_4_;
                auVar51._60_4_ = (uint)(byte)(uVar30 >> 0xf) * auVar48._60_4_;
                auVar48 = vmulps_avx512f(auVar67,auVar51);
                auVar48 = vminps_avx512f(auVar48,auVar44);
                auVar50 = vmulps_avx512f(auVar68,auVar51);
                auVar50 = vminps_avx512f(auVar50,auVar44);
                local_a540 = vsubps_avx512f(auVar44,auVar48);
                local_a500 = vsubps_avx512f(auVar44,auVar50);
                pRVar3 = context->user;
                auVar48 = vpbroadcastd_avx512f();
                auVar50 = vpbroadcastd_avx512f();
                local_a600[0] = (RTCHitN)(char)auVar57._0_4_;
                local_a600[1] = (RTCHitN)(char)(auVar57._0_4_ >> 8);
                local_a600[2] = (RTCHitN)(char)(auVar57._0_4_ >> 0x10);
                local_a600[3] = (RTCHitN)(char)(auVar57._0_4_ >> 0x18);
                local_a600[4] = (RTCHitN)(char)auVar57._4_4_;
                local_a600[5] = (RTCHitN)(char)(auVar57._4_4_ >> 8);
                local_a600[6] = (RTCHitN)(char)(auVar57._4_4_ >> 0x10);
                local_a600[7] = (RTCHitN)(char)(auVar57._4_4_ >> 0x18);
                local_a600[8] = (RTCHitN)(char)auVar57._8_4_;
                local_a600[9] = (RTCHitN)(char)(auVar57._8_4_ >> 8);
                local_a600[10] = (RTCHitN)(char)(auVar57._8_4_ >> 0x10);
                local_a600[0xb] = (RTCHitN)(char)(auVar57._8_4_ >> 0x18);
                local_a600[0xc] = (RTCHitN)(char)auVar57._12_4_;
                local_a600[0xd] = (RTCHitN)(char)(auVar57._12_4_ >> 8);
                local_a600[0xe] = (RTCHitN)(char)(auVar57._12_4_ >> 0x10);
                local_a600[0xf] = (RTCHitN)(char)(auVar57._12_4_ >> 0x18);
                local_a600[0x10] = (RTCHitN)(char)auVar57._16_4_;
                local_a600[0x11] = (RTCHitN)(char)(auVar57._16_4_ >> 8);
                local_a600[0x12] = (RTCHitN)(char)(auVar57._16_4_ >> 0x10);
                local_a600[0x13] = (RTCHitN)(char)(auVar57._16_4_ >> 0x18);
                local_a600[0x14] = (RTCHitN)(char)auVar57._20_4_;
                local_a600[0x15] = (RTCHitN)(char)(auVar57._20_4_ >> 8);
                local_a600[0x16] = (RTCHitN)(char)(auVar57._20_4_ >> 0x10);
                local_a600[0x17] = (RTCHitN)(char)(auVar57._20_4_ >> 0x18);
                local_a600[0x18] = (RTCHitN)(char)auVar57._24_4_;
                local_a600[0x19] = (RTCHitN)(char)(auVar57._24_4_ >> 8);
                local_a600[0x1a] = (RTCHitN)(char)(auVar57._24_4_ >> 0x10);
                local_a600[0x1b] = (RTCHitN)(char)(auVar57._24_4_ >> 0x18);
                local_a600[0x1c] = (RTCHitN)(char)auVar57._28_4_;
                local_a600[0x1d] = (RTCHitN)(char)(auVar57._28_4_ >> 8);
                local_a600[0x1e] = (RTCHitN)(char)(auVar57._28_4_ >> 0x10);
                local_a600[0x1f] = (RTCHitN)(char)(auVar57._28_4_ >> 0x18);
                local_a600[0x20] = (RTCHitN)(char)auVar57._32_4_;
                local_a600[0x21] = (RTCHitN)(char)(auVar57._32_4_ >> 8);
                local_a600[0x22] = (RTCHitN)(char)(auVar57._32_4_ >> 0x10);
                local_a600[0x23] = (RTCHitN)(char)(auVar57._32_4_ >> 0x18);
                local_a600[0x24] = (RTCHitN)(char)auVar57._36_4_;
                local_a600[0x25] = (RTCHitN)(char)(auVar57._36_4_ >> 8);
                local_a600[0x26] = (RTCHitN)(char)(auVar57._36_4_ >> 0x10);
                local_a600[0x27] = (RTCHitN)(char)(auVar57._36_4_ >> 0x18);
                local_a600[0x28] = (RTCHitN)(char)auVar57._40_4_;
                local_a600[0x29] = (RTCHitN)(char)(auVar57._40_4_ >> 8);
                local_a600[0x2a] = (RTCHitN)(char)(auVar57._40_4_ >> 0x10);
                local_a600[0x2b] = (RTCHitN)(char)(auVar57._40_4_ >> 0x18);
                local_a600[0x2c] = (RTCHitN)(char)auVar57._44_4_;
                local_a600[0x2d] = (RTCHitN)(char)(auVar57._44_4_ >> 8);
                local_a600[0x2e] = (RTCHitN)(char)(auVar57._44_4_ >> 0x10);
                local_a600[0x2f] = (RTCHitN)(char)(auVar57._44_4_ >> 0x18);
                local_a600[0x30] = (RTCHitN)(char)auVar57._48_4_;
                local_a600[0x31] = (RTCHitN)(char)(auVar57._48_4_ >> 8);
                local_a600[0x32] = (RTCHitN)(char)(auVar57._48_4_ >> 0x10);
                local_a600[0x33] = (RTCHitN)(char)(auVar57._48_4_ >> 0x18);
                local_a600[0x34] = (RTCHitN)(char)auVar57._52_4_;
                local_a600[0x35] = (RTCHitN)(char)(auVar57._52_4_ >> 8);
                local_a600[0x36] = (RTCHitN)(char)(auVar57._52_4_ >> 0x10);
                local_a600[0x37] = (RTCHitN)(char)(auVar57._52_4_ >> 0x18);
                local_a600[0x38] = (RTCHitN)(char)auVar57._56_4_;
                local_a600[0x39] = (RTCHitN)(char)(auVar57._56_4_ >> 8);
                local_a600[0x3a] = (RTCHitN)(char)(auVar57._56_4_ >> 0x10);
                local_a600[0x3b] = (RTCHitN)(char)(auVar57._56_4_ >> 0x18);
                local_a600[0x3c] = (RTCHitN)(char)auVar57._60_4_;
                local_a600[0x3d] = (RTCHitN)(char)(auVar57._60_4_ >> 8);
                local_a600[0x3e] = (RTCHitN)(char)(auVar57._60_4_ >> 0x10);
                local_a600[0x3f] = (RTCHitN)(char)(auVar57._60_4_ >> 0x18);
                local_a5c0 = auVar59;
                local_a580 = auVar62;
                local_a4c0 = vmovdqa64_avx512f(auVar50);
                local_a480 = vmovdqa64_avx512f(auVar48);
                auVar40 = vpcmpeqd_avx2(auVar40,auVar40);
                local_a768[3] = auVar40;
                local_a768[2] = auVar40;
                local_a768[1] = auVar40;
                *local_a768 = auVar40;
                local_a440 = vbroadcastss_avx512f(ZEXT416(pRVar3->instID[0]));
                local_a400 = vbroadcastss_avx512f(ZEXT416(pRVar3->instPrimID[0]));
                auVar48 = vblendmps_avx512f(auVar47,auVar49);
                bVar37 = (bool)((byte)uVar29 & 1);
                bVar5 = (bool)((byte)(uVar29 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar29 >> 2) & 1);
                bVar7 = (bool)((byte)(uVar29 >> 3) & 1);
                bVar8 = (bool)((byte)(uVar29 >> 4) & 1);
                bVar9 = (bool)((byte)(uVar29 >> 5) & 1);
                bVar10 = (bool)((byte)(uVar29 >> 6) & 1);
                bVar11 = (bool)((byte)(uVar29 >> 7) & 1);
                bVar12 = (byte)(uVar29 >> 8);
                bVar13 = (bool)(bVar12 >> 1 & 1);
                bVar14 = (bool)(bVar12 >> 2 & 1);
                bVar15 = (bool)(bVar12 >> 3 & 1);
                bVar16 = (bool)(bVar12 >> 4 & 1);
                bVar17 = (bool)(bVar12 >> 5 & 1);
                bVar18 = (bool)(bVar12 >> 6 & 1);
                *(uint *)(ray + 0x200) =
                     (uint)bVar37 * auVar48._0_4_ | (uint)!bVar37 * local_a400._0_4_;
                *(uint *)(ray + 0x204) =
                     (uint)bVar5 * auVar48._4_4_ | (uint)!bVar5 * local_a400._4_4_;
                *(uint *)(ray + 0x208) =
                     (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * local_a400._8_4_;
                *(uint *)(ray + 0x20c) =
                     (uint)bVar7 * auVar48._12_4_ | (uint)!bVar7 * local_a400._12_4_;
                *(uint *)(ray + 0x210) =
                     (uint)bVar8 * auVar48._16_4_ | (uint)!bVar8 * local_a400._16_4_;
                *(uint *)(ray + 0x214) =
                     (uint)bVar9 * auVar48._20_4_ | (uint)!bVar9 * local_a400._20_4_;
                *(uint *)(ray + 0x218) =
                     (uint)bVar10 * auVar48._24_4_ | (uint)!bVar10 * local_a400._24_4_;
                *(uint *)(ray + 0x21c) =
                     (uint)bVar11 * auVar48._28_4_ | (uint)!bVar11 * local_a400._28_4_;
                *(uint *)(ray + 0x220) =
                     (uint)(bVar12 & 1) * auVar48._32_4_ |
                     (uint)!(bool)(bVar12 & 1) * local_a400._32_4_;
                *(uint *)(ray + 0x224) =
                     (uint)bVar13 * auVar48._36_4_ | (uint)!bVar13 * local_a400._36_4_;
                *(uint *)(ray + 0x228) =
                     (uint)bVar14 * auVar48._40_4_ | (uint)!bVar14 * local_a400._40_4_;
                *(uint *)(ray + 0x22c) =
                     (uint)bVar15 * auVar48._44_4_ | (uint)!bVar15 * local_a400._44_4_;
                *(uint *)(ray + 0x230) =
                     (uint)bVar16 * auVar48._48_4_ | (uint)!bVar16 * local_a400._48_4_;
                *(uint *)(ray + 0x234) =
                     (uint)bVar17 * auVar48._52_4_ | (uint)!bVar17 * local_a400._52_4_;
                *(uint *)(ray + 0x238) =
                     (uint)bVar18 * auVar48._56_4_ | (uint)!bVar18 * local_a400._56_4_;
                *(uint *)(ray + 0x23c) =
                     (uint)(uVar29 >> 0xf) * auVar48._60_4_ |
                     (uint)!(bool)(bVar12 >> 7) * local_a400._60_4_;
                auVar48 = vpmovm2d_avx512dq((ulong)uVar27);
                local_a6c0 = vmovdqa64_avx512f(auVar48);
                local_a758.valid = (int *)local_a6c0;
                local_a758.geometryUserPtr = pGVar2->userPtr;
                local_a758.context = context->user;
                local_a758.hit = local_a600;
                local_a758.N = 0x10;
                local_a680 = auVar47;
                uVar30 = uVar38;
                local_a758.ray = (RTCRayN *)ray;
                if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar2->occlusionFilterN)(&local_a758);
                  auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  uVar30 = uVar38 & 0xffffffff;
                  auVar45 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                  auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar43 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
                  auVar42 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  lVar33 = local_a788;
                }
                auVar47 = vmovdqa64_avx512f(local_a6c0);
                uVar28 = vptestmd_avx512f(auVar47,auVar47);
                if ((short)uVar28 != 0) {
                  p_Var4 = context->args->filter;
                  if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_a700._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (*p_Var4)(&local_a758);
                    auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                    auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                    uVar30 = uVar38 & 0xffffffff;
                    auVar45 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                    auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                    auVar43 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
                    auVar42 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                    lVar33 = local_a788;
                  }
                  auVar47 = vmovdqa64_avx512f(local_a6c0);
                  uVar28 = vptestmd_avx512f(auVar47,auVar47);
                  auVar47 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                  bVar37 = (bool)((byte)uVar28 & 1);
                  bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
                  bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
                  bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
                  bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
                  bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
                  bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
                  bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
                  bVar13 = (bool)((byte)(uVar28 >> 8) & 1);
                  bVar14 = (bool)((byte)(uVar28 >> 9) & 1);
                  bVar15 = (bool)((byte)(uVar28 >> 10) & 1);
                  bVar16 = (bool)((byte)(uVar28 >> 0xb) & 1);
                  bVar17 = (bool)((byte)(uVar28 >> 0xc) & 1);
                  bVar18 = (bool)((byte)(uVar28 >> 0xd) & 1);
                  bVar19 = (bool)((byte)(uVar28 >> 0xe) & 1);
                  bVar20 = SUB81(uVar28 >> 0xf,0);
                  *(uint *)(local_a758.ray + 0x200) =
                       (uint)bVar37 * auVar47._0_4_ |
                       (uint)!bVar37 * *(int *)(local_a758.ray + 0x200);
                  *(uint *)(local_a758.ray + 0x204) =
                       (uint)bVar5 * auVar47._4_4_ | (uint)!bVar5 * *(int *)(local_a758.ray + 0x204)
                  ;
                  *(uint *)(local_a758.ray + 0x208) =
                       (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * *(int *)(local_a758.ray + 0x208)
                  ;
                  *(uint *)(local_a758.ray + 0x20c) =
                       (uint)bVar7 * auVar47._12_4_ |
                       (uint)!bVar7 * *(int *)(local_a758.ray + 0x20c);
                  *(uint *)(local_a758.ray + 0x210) =
                       (uint)bVar8 * auVar47._16_4_ |
                       (uint)!bVar8 * *(int *)(local_a758.ray + 0x210);
                  *(uint *)(local_a758.ray + 0x214) =
                       (uint)bVar9 * auVar47._20_4_ |
                       (uint)!bVar9 * *(int *)(local_a758.ray + 0x214);
                  *(uint *)(local_a758.ray + 0x218) =
                       (uint)bVar10 * auVar47._24_4_ |
                       (uint)!bVar10 * *(int *)(local_a758.ray + 0x218);
                  *(uint *)(local_a758.ray + 0x21c) =
                       (uint)bVar11 * auVar47._28_4_ |
                       (uint)!bVar11 * *(int *)(local_a758.ray + 0x21c);
                  *(uint *)(local_a758.ray + 0x220) =
                       (uint)bVar13 * auVar47._32_4_ |
                       (uint)!bVar13 * *(int *)(local_a758.ray + 0x220);
                  *(uint *)(local_a758.ray + 0x224) =
                       (uint)bVar14 * auVar47._36_4_ |
                       (uint)!bVar14 * *(int *)(local_a758.ray + 0x224);
                  *(uint *)(local_a758.ray + 0x228) =
                       (uint)bVar15 * auVar47._40_4_ |
                       (uint)!bVar15 * *(int *)(local_a758.ray + 0x228);
                  *(uint *)(local_a758.ray + 0x22c) =
                       (uint)bVar16 * auVar47._44_4_ |
                       (uint)!bVar16 * *(int *)(local_a758.ray + 0x22c);
                  *(uint *)(local_a758.ray + 0x230) =
                       (uint)bVar17 * auVar47._48_4_ |
                       (uint)!bVar17 * *(int *)(local_a758.ray + 0x230);
                  *(uint *)(local_a758.ray + 0x234) =
                       (uint)bVar18 * auVar47._52_4_ |
                       (uint)!bVar18 * *(int *)(local_a758.ray + 0x234);
                  *(uint *)(local_a758.ray + 0x238) =
                       (uint)bVar19 * auVar47._56_4_ |
                       (uint)!bVar19 * *(int *)(local_a758.ray + 0x238);
                  *(uint *)(local_a758.ray + 0x23c) =
                       (uint)bVar20 * auVar47._60_4_ |
                       (uint)!bVar20 * *(int *)(local_a758.ray + 0x23c);
                }
                uVar27 = (uint)uVar28;
                bVar37 = (bool)((byte)uVar28 & 1);
                bVar5 = (bool)((byte)(uVar28 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
                bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
                bVar8 = (bool)((byte)(uVar28 >> 4) & 1);
                bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
                bVar10 = (bool)((byte)(uVar28 >> 6) & 1);
                bVar11 = (bool)((byte)(uVar28 >> 7) & 1);
                bVar13 = (bool)((byte)(uVar28 >> 8) & 1);
                bVar14 = (bool)((byte)(uVar28 >> 9) & 1);
                bVar15 = (bool)((byte)(uVar28 >> 10) & 1);
                bVar16 = (bool)((byte)(uVar28 >> 0xb) & 1);
                bVar17 = (bool)((byte)(uVar28 >> 0xc) & 1);
                bVar18 = (bool)((byte)(uVar28 >> 0xd) & 1);
                bVar19 = (bool)((byte)(uVar28 >> 0xe) & 1);
                bVar20 = SUB81(uVar28 >> 0xf,0);
                *(uint *)local_a778 =
                     (uint)bVar37 * *(int *)local_a778 | (uint)!bVar37 * local_a680._0_4_;
                *(uint *)(local_a778 + 4) =
                     (uint)bVar5 * *(int *)(local_a778 + 4) | (uint)!bVar5 * local_a680._4_4_;
                *(uint *)(local_a778 + 8) =
                     (uint)bVar6 * *(int *)(local_a778 + 8) | (uint)!bVar6 * local_a680._8_4_;
                *(uint *)(local_a778 + 0xc) =
                     (uint)bVar7 * *(int *)(local_a778 + 0xc) | (uint)!bVar7 * local_a680._12_4_;
                *(uint *)(local_a778 + 0x10) =
                     (uint)bVar8 * *(int *)(local_a778 + 0x10) | (uint)!bVar8 * local_a680._16_4_;
                *(uint *)(local_a778 + 0x14) =
                     (uint)bVar9 * *(int *)(local_a778 + 0x14) | (uint)!bVar9 * local_a680._20_4_;
                *(uint *)(local_a778 + 0x18) =
                     (uint)bVar10 * *(int *)(local_a778 + 0x18) | (uint)!bVar10 * local_a680._24_4_;
                *(uint *)(local_a778 + 0x1c) =
                     (uint)bVar11 * *(int *)(local_a778 + 0x1c) | (uint)!bVar11 * local_a680._28_4_;
                *(uint *)(local_a778 + 0x20) =
                     (uint)bVar13 * *(int *)(local_a778 + 0x20) | (uint)!bVar13 * local_a680._32_4_;
                *(uint *)(local_a778 + 0x24) =
                     (uint)bVar14 * *(int *)(local_a778 + 0x24) | (uint)!bVar14 * local_a680._36_4_;
                *(uint *)(local_a778 + 0x28) =
                     (uint)bVar15 * *(int *)(local_a778 + 0x28) | (uint)!bVar15 * local_a680._40_4_;
                *(uint *)(local_a778 + 0x2c) =
                     (uint)bVar16 * *(int *)(local_a778 + 0x2c) | (uint)!bVar16 * local_a680._44_4_;
                *(uint *)(local_a778 + 0x30) =
                     (uint)bVar17 * *(int *)(local_a778 + 0x30) | (uint)!bVar17 * local_a680._48_4_;
                *(uint *)(local_a778 + 0x34) =
                     (uint)bVar18 * *(int *)(local_a778 + 0x34) | (uint)!bVar18 * local_a680._52_4_;
                *(uint *)(local_a778 + 0x38) =
                     (uint)bVar19 * *(int *)(local_a778 + 0x38) | (uint)!bVar19 * local_a680._56_4_;
                *(uint *)(local_a778 + 0x3c) =
                     (uint)bVar20 * *(int *)(local_a778 + 0x3c) | (uint)!bVar20 * local_a680._60_4_;
                uVar38 = uVar30;
              }
              uVar26 = ~uVar27 & uVar26;
            }
          }
        }
        bVar37 = (short)uVar26 != 0;
      }
      uVar29 = (ushort)uVar26;
      if ((!bVar37) || (bVar37 = 2 < uVar34, uVar34 = uVar34 + 1, bVar37)) break;
    }
    uVar29 = (ushort)local_a76c & uVar29;
    uVar26 = CONCAT22((short)(local_a76c >> 0x10),uVar29);
    if (uVar29 == 0) break;
  }
  uVar26 = ~uVar26;
LAB_008e1f91:
  local_a7b4 = local_a7b4 | uVar26;
  uVar30 = local_a760;
  if ((short)local_a7b4 == -1) {
LAB_008e1fbf:
    iVar39 = 3;
  }
  else {
    auVar47 = vbroadcastss_avx512f(ZEXT416(0xff800000));
    bVar37 = (bool)((byte)local_a7b4 & 1);
    bVar5 = (bool)((byte)(local_a7b4 >> 1) & 1);
    bVar6 = (bool)((byte)(local_a7b4 >> 2) & 1);
    bVar7 = (bool)((byte)(local_a7b4 >> 3) & 1);
    bVar8 = (bool)((byte)(local_a7b4 >> 4) & 1);
    bVar9 = (bool)((byte)(local_a7b4 >> 5) & 1);
    bVar10 = (bool)((byte)(local_a7b4 >> 6) & 1);
    bVar11 = (bool)((byte)(local_a7b4 >> 7) & 1);
    bVar13 = (bool)((byte)(local_a7b4 >> 8) & 1);
    bVar14 = (bool)((byte)(local_a7b4 >> 9) & 1);
    bVar15 = (bool)((byte)(local_a7b4 >> 10) & 1);
    bVar16 = (bool)((byte)(local_a7b4 >> 0xb) & 1);
    bVar17 = (bool)((byte)(local_a7b4 >> 0xc) & 1);
    bVar18 = (bool)((byte)(local_a7b4 >> 0xd) & 1);
    bVar19 = (bool)((byte)(local_a7b4 >> 0xe) & 1);
    bVar20 = (bool)((byte)(local_a7b4 >> 0xf) & 1);
    local_a080 = (uint)bVar37 * auVar47._0_4_ | !bVar37 * local_a080;
    uStack_a07c = (uint)bVar5 * auVar47._4_4_ | !bVar5 * uStack_a07c;
    uStack_a078 = (uint)bVar6 * auVar47._8_4_ | !bVar6 * uStack_a078;
    uStack_a074 = (uint)bVar7 * auVar47._12_4_ | !bVar7 * uStack_a074;
    uStack_a070 = (uint)bVar8 * auVar47._16_4_ | !bVar8 * uStack_a070;
    uStack_a06c = (uint)bVar9 * auVar47._20_4_ | !bVar9 * uStack_a06c;
    uStack_a068 = (uint)bVar10 * auVar47._24_4_ | !bVar10 * uStack_a068;
    uStack_a064 = (uint)bVar11 * auVar47._28_4_ | !bVar11 * uStack_a064;
    uStack_a060 = (uint)bVar13 * auVar47._32_4_ | !bVar13 * uStack_a060;
    uStack_a05c = (uint)bVar14 * auVar47._36_4_ | !bVar14 * uStack_a05c;
    uStack_a058 = (uint)bVar15 * auVar47._40_4_ | !bVar15 * uStack_a058;
    uStack_a054 = (uint)bVar16 * auVar47._44_4_ | !bVar16 * uStack_a054;
    uStack_a050 = (uint)bVar17 * auVar47._48_4_ | !bVar17 * uStack_a050;
    uStack_a04c = (uint)bVar18 * auVar47._52_4_ | !bVar18 * uStack_a04c;
    uStack_a048 = (uint)bVar19 * auVar47._56_4_ | !bVar19 * uStack_a048;
    uStack_a044 = (uint)bVar20 * auVar47._60_4_ | !bVar20 * uStack_a044;
    iVar39 = 0;
  }
LAB_008e1fc2:
  if (iVar39 == 3) {
    local_a7b4 = local_a7b4 & (uint)uVar38;
    bVar37 = (bool)((byte)local_a7b4 & 1);
    bVar5 = (bool)((byte)(local_a7b4 >> 1) & 1);
    bVar6 = (bool)((byte)(local_a7b4 >> 2) & 1);
    bVar7 = (bool)((byte)(local_a7b4 >> 3) & 1);
    bVar8 = (bool)((byte)(local_a7b4 >> 4) & 1);
    bVar9 = (bool)((byte)(local_a7b4 >> 5) & 1);
    bVar10 = (bool)((byte)(local_a7b4 >> 6) & 1);
    bVar11 = (bool)((byte)(local_a7b4 >> 7) & 1);
    bVar13 = (bool)((byte)(local_a7b4 >> 8) & 1);
    bVar14 = (bool)((byte)(local_a7b4 >> 9) & 1);
    bVar15 = (bool)((byte)(local_a7b4 >> 10) & 1);
    bVar16 = (bool)((byte)(local_a7b4 >> 0xb) & 1);
    bVar17 = (bool)((byte)(local_a7b4 >> 0xc) & 1);
    bVar18 = (bool)((byte)(local_a7b4 >> 0xd) & 1);
    bVar19 = (bool)((byte)(local_a7b4 >> 0xe) & 1);
    bVar20 = (bool)((byte)(local_a7b4 >> 0xf) & 1);
    *(uint *)local_a778 = (uint)bVar37 * auVar46._0_4_ | (uint)!bVar37 * *(int *)local_a778;
    *(uint *)(local_a778 + 4) =
         (uint)bVar5 * auVar46._4_4_ | (uint)!bVar5 * *(int *)(local_a778 + 4);
    *(uint *)(local_a778 + 8) =
         (uint)bVar6 * auVar46._8_4_ | (uint)!bVar6 * *(int *)(local_a778 + 8);
    *(uint *)(local_a778 + 0xc) =
         (uint)bVar7 * auVar46._12_4_ | (uint)!bVar7 * *(int *)(local_a778 + 0xc);
    *(uint *)(local_a778 + 0x10) =
         (uint)bVar8 * auVar46._16_4_ | (uint)!bVar8 * *(int *)(local_a778 + 0x10);
    *(uint *)(local_a778 + 0x14) =
         (uint)bVar9 * auVar46._20_4_ | (uint)!bVar9 * *(int *)(local_a778 + 0x14);
    *(uint *)(local_a778 + 0x18) =
         (uint)bVar10 * auVar46._24_4_ | (uint)!bVar10 * *(int *)(local_a778 + 0x18);
    *(uint *)(local_a778 + 0x1c) =
         (uint)bVar11 * auVar46._28_4_ | (uint)!bVar11 * *(int *)(local_a778 + 0x1c);
    *(uint *)(local_a778 + 0x20) =
         (uint)bVar13 * auVar46._32_4_ | (uint)!bVar13 * *(int *)(local_a778 + 0x20);
    *(uint *)(local_a778 + 0x24) =
         (uint)bVar14 * auVar46._36_4_ | (uint)!bVar14 * *(int *)(local_a778 + 0x24);
    *(uint *)(local_a778 + 0x28) =
         (uint)bVar15 * auVar46._40_4_ | (uint)!bVar15 * *(int *)(local_a778 + 0x28);
    *(uint *)(local_a778 + 0x2c) =
         (uint)bVar16 * auVar46._44_4_ | (uint)!bVar16 * *(int *)(local_a778 + 0x2c);
    *(uint *)(local_a778 + 0x30) =
         (uint)bVar17 * auVar46._48_4_ | (uint)!bVar17 * *(int *)(local_a778 + 0x30);
    *(uint *)(local_a778 + 0x34) =
         (uint)bVar18 * auVar46._52_4_ | (uint)!bVar18 * *(int *)(local_a778 + 0x34);
    *(uint *)(local_a778 + 0x38) =
         (uint)bVar19 * auVar46._56_4_ | (uint)!bVar19 * *(int *)(local_a778 + 0x38);
    *(uint *)(local_a778 + 0x3c) =
         (uint)bVar20 * auVar46._60_4_ | (uint)!bVar20 * *(int *)(local_a778 + 0x3c);
    return;
  }
  goto LAB_008e0f5c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }